

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avx512vnni_gemm.h
# Opt level: O0

void intgemm::AVX512VNNI::Kernels8::Multiply<intgemm::callbacks::UnquantizeAndAddBiasAndWriteRelu>
               (int8_t *A,int8_t *B,Index A_rows,Index width,Index B_cols,
               UnquantizeAndAddBiasAndWriteRelu callback)

{
  undefined1 auVar1 [64];
  byte bVar2;
  bool bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  ulong uVar11;
  char cVar12;
  __m512i b;
  __m512i b_00;
  __m512i b_01;
  __m512i b_02;
  __m512i b_03;
  __m512i b_04;
  __m512i b_05;
  __m512i b_06;
  __m512i a_00;
  __m512i a_01;
  __m512i a_02;
  __m512i a_03;
  __m512i a_04;
  __m512i a_05;
  __m512i a_06;
  __m512i a_07;
  vector_t<CPUType::AVX2,_int> input;
  __m512i pack4567_00;
  __m512i pack0123_00;
  __m512i sum3_00;
  __m512i sum3_01;
  __m512i sum2_00;
  __m512i sum2_01;
  __m512i sum1_00;
  __m512i sum1_01;
  __m512i sum0_00;
  __m512i sum0_01;
  undefined1 (*pauVar13) [64];
  uint in_ECX;
  uint in_EDX;
  long in_RSI;
  long in_RDI;
  uint in_R8D;
  undefined1 auVar14 [32];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 in_ZMM0 [64];
  __m256i total;
  Register pack4567;
  Register pack0123;
  Register a_positive;
  __mmask64 neg_mask;
  Register b7;
  Register b6;
  Register b5;
  Register b4;
  Register b3;
  Register b2;
  Register b1;
  Register b0;
  Register a;
  Register sum7;
  Register sum6;
  Register sum5;
  Register sum4;
  Register sum3;
  Register sum2;
  Register sum1;
  Register sum0;
  Register *B_live;
  Register *A_end;
  Register *A_live;
  Index A_rowidx;
  Register *B0_col;
  Index B0_colidx;
  Register zeros;
  Index simd_width;
  CallbackImpl<(intgemm::CPUType)3,_intgemm::callbacks::UnquantizeAndAddBiasAndWriteRelu>
  callback_impl;
  undefined1 in_stack_ffffffffffffcc80 [64];
  longlong in_stack_ffffffffffffcd38;
  undefined1 in_stack_ffffffffffffcd40 [56];
  undefined8 in_stack_ffffffffffffcd78;
  undefined1 in_stack_ffffffffffffcd80 [32];
  undefined8 in_stack_ffffffffffffcda0;
  undefined8 in_stack_ffffffffffffcda8;
  OutputBufferInfo *in_stack_ffffffffffffcdb0;
  undefined1 in_stack_ffffffffffffcde0 [16];
  __m512i *in_stack_ffffffffffffcdf0;
  CallbackImpl<(intgemm::CPUType)3,_intgemm::callbacks::UnquantizeAndAddBiasAndWriteRelu> *this;
  undefined1 auVar40 [56];
  undefined1 in_stack_ffffffffffffce80 [32];
  undefined8 in_stack_ffffffffffffcea0;
  undefined8 in_stack_ffffffffffffcea8;
  OutputBufferInfo *in_stack_ffffffffffffceb0;
  undefined8 uStack_3148;
  longlong in_stack_ffffffffffffcef8;
  undefined1 in_stack_ffffffffffffcf00 [56];
  longlong in_stack_ffffffffffffcf38;
  undefined1 in_stack_ffffffffffffcf40 [56];
  longlong in_stack_ffffffffffffcf78;
  undefined1 in_stack_ffffffffffffcf80 [56];
  longlong in_stack_ffffffffffffcfb8;
  undefined1 in_stack_ffffffffffffcfc0 [56];
  undefined1 (*local_1f30) [64];
  undefined1 (*local_1f20) [64];
  uint local_1f14;
  uint local_1f04;
  
  callbacks::CallbackImpl<(intgemm::CPUType)3,_intgemm::callbacks::UnquantizeAndAddBiasAndWriteRelu>
  ::CallbackImpl(in_stack_ffffffffffffcc80._8_8_,in_stack_ffffffffffffcc80._0_8_);
  setzero_si<long_long__vector(8)>();
  auVar1 = vmovdqa64_avx512f(in_ZMM0);
  for (local_1f04 = 0; local_1f04 < in_R8D; local_1f04 = local_1f04 + 8) {
    for (local_1f14 = 0; local_1f14 < in_EDX; local_1f14 = local_1f14 + 1) {
      local_1f20 = (undefined1 (*) [64])(in_RDI + (ulong)(local_1f14 * in_ECX));
      pauVar13 = local_1f20 + (in_ECX >> 6);
      auVar15 = vmovdqa64_avx512f(auVar1);
      auVar15 = vmovdqa64_avx512f(auVar15);
      auVar16 = vmovdqa64_avx512f(auVar1);
      auVar16 = vmovdqa64_avx512f(auVar16);
      auVar17 = vmovdqa64_avx512f(auVar1);
      auVar17 = vmovdqa64_avx512f(auVar17);
      auVar18 = vmovdqa64_avx512f(auVar1);
      auVar18 = vmovdqa64_avx512f(auVar18);
      auVar19 = vmovdqa64_avx512f(auVar1);
      auVar19 = vmovdqa64_avx512f(auVar19);
      auVar20 = vmovdqa64_avx512f(auVar1);
      auVar20 = vmovdqa64_avx512f(auVar20);
      auVar21 = vmovdqa64_avx512f(auVar1);
      auVar21 = vmovdqa64_avx512f(auVar21);
      auVar22 = vmovdqa64_avx512f(auVar1);
      auVar22 = vmovdqa64_avx512f(auVar22);
      local_1f30 = (undefined1 (*) [64])(in_RSI + (ulong)(local_1f04 * (in_ECX >> 6)) * 0x40);
      for (; local_1f20 != pauVar13; local_1f20 = local_1f20 + 1) {
        auVar23 = vmovdqa64_avx512f(*local_1f20);
        auVar23 = vmovdqa64_avx512f(auVar23);
        auVar24 = vmovdqa64_avx512f(*local_1f30);
        auVar24 = vmovdqa64_avx512f(auVar24);
        auVar25 = vmovdqa64_avx512f(local_1f30[1]);
        auVar25 = vmovdqa64_avx512f(auVar25);
        auVar26 = vmovdqa64_avx512f(local_1f30[2]);
        auVar26 = vmovdqa64_avx512f(auVar26);
        auVar27 = vmovdqa64_avx512f(local_1f30[3]);
        auVar27 = vmovdqa64_avx512f(auVar27);
        auVar28 = vmovdqa64_avx512f(local_1f30[4]);
        auVar28 = vmovdqa64_avx512f(auVar28);
        auVar29 = vmovdqa64_avx512f(local_1f30[5]);
        auVar29 = vmovdqa64_avx512f(auVar29);
        auVar30 = vmovdqa64_avx512f(local_1f30[6]);
        auVar30 = vmovdqa64_avx512f(auVar30);
        auVar31 = vmovdqa64_avx512f(local_1f30[7]);
        auVar31 = vmovdqa64_avx512f(auVar31);
        auVar32 = vmovdqa64_avx512f(auVar23);
        auVar33 = vpbroadcastb_avx512bw(ZEXT116(0x80));
        auVar33 = vmovdqa64_avx512f(auVar33);
        auVar34 = vmovdqa64_avx512f(auVar33);
        auVar33 = vmovdqa64_avx512f(auVar32);
        auVar32 = vmovdqa64_avx512f(auVar34);
        auVar32 = vmovdqa64_avx512f(auVar32);
        auVar32 = vmovdqa64_avx512f(auVar32);
        auVar33 = vmovdqa64_avx512f(auVar33);
        auVar33 = vmovdqa64_avx512f(auVar33);
        auVar33 = vmovdqa64_avx512f(auVar33);
        auVar32 = vmovdqa64_avx512f(auVar32);
        auVar33 = vmovdqa64_avx512f(auVar33);
        auVar32 = vmovdqa64_avx512f(auVar32);
        auVar33 = vmovdqa64_avx512f(auVar33);
        auVar32 = vmovdqa64_avx512f(auVar32);
        auVar33 = vmovdqa64_avx512f(auVar33);
        auVar32 = vmovdqa64_avx512f(auVar32);
        auVar32 = vmovdqa64_avx512f(auVar32);
        auVar32 = vmovdqa64_avx512f(auVar32);
        auVar33 = vmovdqa64_avx512f(auVar33);
        auVar33 = vmovdqa64_avx512f(auVar33);
        auVar33 = vmovdqa64_avx512f(auVar33);
        auVar32 = vmovdqa64_avx512f(auVar32);
        auVar33 = vmovdqa64_avx512f(auVar33);
        auVar32 = vmovdqa64_avx512f(auVar32);
        auVar33 = vmovdqa64_avx512f(auVar33);
        auVar32 = vmovdqa64_avx512f(auVar32);
        auVar32 = vpandq_avx512f(auVar33,auVar32);
        auVar33 = vmovdqa64_avx512f(ZEXT1664(ZEXT816(0) << 0x40));
        auVar33 = vmovdqa64_avx512f(auVar33);
        uVar11 = vpcmpb_avx512bw(auVar32,auVar33,4);
        auVar23 = vmovdqa64_avx512f(auVar23);
        auVar23 = vmovdqa64_avx512f(auVar23);
        auVar23 = vmovdqa64_avx512f(auVar23);
        auVar23 = vmovdqa64_avx512f(auVar23);
        auVar23 = vmovdqa64_avx512f(auVar23);
        auVar23 = vmovdqa64_avx512f(auVar23);
        auVar23 = vpabsb_avx512bw(auVar23);
        auVar23 = vmovdqa64_avx512f(auVar23);
        auVar32 = vmovdqa64_avx512f(auVar24);
        auVar33 = vmovdqa64_avx512f(auVar1);
        auVar24 = vmovdqa64_avx512f(auVar32);
        auVar33 = vmovdqa64_avx512f(auVar33);
        auVar32 = vmovdqa64_avx512f(auVar32);
        auVar32 = vmovdqa64_avx512f(auVar32);
        auVar32 = vmovdqa64_avx512f(auVar32);
        auVar33 = vmovdqa64_avx512f(auVar33);
        auVar33 = vmovdqa64_avx512f(auVar33);
        auVar24 = vmovdqa64_avx512f(auVar24);
        auVar24 = vmovdqa64_avx512f(auVar24);
        auVar24 = vmovdqa64_avx512f(auVar24);
        auVar33 = vmovdqa64_avx512f(auVar33);
        auVar32 = vmovdqa64_avx512f(auVar32);
        auVar24 = vmovdqa64_avx512f(auVar24);
        auVar33 = vmovdqa64_avx512f(auVar33);
        auVar32 = vmovdqa64_avx512f(auVar32);
        auVar33 = vmovdqa64_avx512f(auVar33);
        auVar32 = vmovdqa64_avx512f(auVar32);
        auVar33 = vmovdqa64_avx512f(auVar33);
        auVar32 = vmovdqa64_avx512f(auVar32);
        auVar32 = vmovdqa64_avx512f(auVar32);
        auVar32 = vmovdqa64_avx512f(auVar32);
        auVar33 = vmovdqa64_avx512f(auVar33);
        auVar33 = vmovdqa64_avx512f(auVar33);
        auVar33 = vmovdqa64_avx512f(auVar33);
        auVar32 = vmovdqa64_avx512f(auVar32);
        auVar33 = vmovdqa64_avx512f(auVar33);
        auVar32 = vmovdqa64_avx512f(auVar32);
        auVar33 = vmovdqa64_avx512f(auVar33);
        auVar32 = vmovdqa64_avx512f(auVar32);
        auVar24 = vmovdqa64_avx512f(auVar24);
        auVar33 = vpsubb_avx512bw(auVar33,auVar32);
        bVar2 = (byte)uVar11;
        auVar32[0] = (bVar2 & 1) * auVar33[0] | !(bool)(bVar2 & 1) * auVar24[0];
        bVar3 = (bool)((byte)(uVar11 >> 1) & 1);
        auVar32[1] = bVar3 * auVar33[1] | !bVar3 * auVar24[1];
        bVar3 = (bool)((byte)(uVar11 >> 2) & 1);
        auVar32[2] = bVar3 * auVar33[2] | !bVar3 * auVar24[2];
        bVar3 = (bool)((byte)(uVar11 >> 3) & 1);
        auVar32[3] = bVar3 * auVar33[3] | !bVar3 * auVar24[3];
        bVar3 = (bool)((byte)(uVar11 >> 4) & 1);
        auVar32[4] = bVar3 * auVar33[4] | !bVar3 * auVar24[4];
        bVar3 = (bool)((byte)(uVar11 >> 5) & 1);
        auVar32[5] = bVar3 * auVar33[5] | !bVar3 * auVar24[5];
        bVar3 = (bool)((byte)(uVar11 >> 6) & 1);
        auVar32[6] = bVar3 * auVar33[6] | !bVar3 * auVar24[6];
        bVar3 = (bool)((byte)(uVar11 >> 7) & 1);
        auVar32[7] = bVar3 * auVar33[7] | !bVar3 * auVar24[7];
        bVar4 = (byte)(uVar11 >> 8);
        auVar32[8] = (bVar4 & 1) * auVar33[8] | !(bool)(bVar4 & 1) * auVar24[8];
        bVar3 = (bool)((byte)(uVar11 >> 9) & 1);
        auVar32[9] = bVar3 * auVar33[9] | !bVar3 * auVar24[9];
        bVar3 = (bool)((byte)(uVar11 >> 10) & 1);
        auVar32[10] = bVar3 * auVar33[10] | !bVar3 * auVar24[10];
        bVar3 = (bool)((byte)(uVar11 >> 0xb) & 1);
        auVar32[0xb] = bVar3 * auVar33[0xb] | !bVar3 * auVar24[0xb];
        bVar3 = (bool)((byte)(uVar11 >> 0xc) & 1);
        auVar32[0xc] = bVar3 * auVar33[0xc] | !bVar3 * auVar24[0xc];
        bVar3 = (bool)((byte)(uVar11 >> 0xd) & 1);
        auVar32[0xd] = bVar3 * auVar33[0xd] | !bVar3 * auVar24[0xd];
        bVar3 = (bool)((byte)(uVar11 >> 0xe) & 1);
        auVar32[0xe] = bVar3 * auVar33[0xe] | !bVar3 * auVar24[0xe];
        bVar3 = (bool)((byte)(uVar11 >> 0xf) & 1);
        auVar32[0xf] = bVar3 * auVar33[0xf] | !bVar3 * auVar24[0xf];
        bVar5 = (byte)(uVar11 >> 0x10);
        auVar32[0x10] = (bVar5 & 1) * auVar33[0x10] | !(bool)(bVar5 & 1) * auVar24[0x10];
        bVar3 = (bool)((byte)(uVar11 >> 0x11) & 1);
        auVar32[0x11] = bVar3 * auVar33[0x11] | !bVar3 * auVar24[0x11];
        bVar3 = (bool)((byte)(uVar11 >> 0x12) & 1);
        auVar32[0x12] = bVar3 * auVar33[0x12] | !bVar3 * auVar24[0x12];
        bVar3 = (bool)((byte)(uVar11 >> 0x13) & 1);
        auVar32[0x13] = bVar3 * auVar33[0x13] | !bVar3 * auVar24[0x13];
        bVar3 = (bool)((byte)(uVar11 >> 0x14) & 1);
        auVar32[0x14] = bVar3 * auVar33[0x14] | !bVar3 * auVar24[0x14];
        bVar3 = (bool)((byte)(uVar11 >> 0x15) & 1);
        auVar32[0x15] = bVar3 * auVar33[0x15] | !bVar3 * auVar24[0x15];
        bVar3 = (bool)((byte)(uVar11 >> 0x16) & 1);
        auVar32[0x16] = bVar3 * auVar33[0x16] | !bVar3 * auVar24[0x16];
        bVar3 = (bool)((byte)(uVar11 >> 0x17) & 1);
        auVar32[0x17] = bVar3 * auVar33[0x17] | !bVar3 * auVar24[0x17];
        bVar6 = (byte)(uVar11 >> 0x18);
        auVar32[0x18] = (bVar6 & 1) * auVar33[0x18] | !(bool)(bVar6 & 1) * auVar24[0x18];
        bVar3 = (bool)((byte)(uVar11 >> 0x19) & 1);
        auVar32[0x19] = bVar3 * auVar33[0x19] | !bVar3 * auVar24[0x19];
        bVar3 = (bool)((byte)(uVar11 >> 0x1a) & 1);
        auVar32[0x1a] = bVar3 * auVar33[0x1a] | !bVar3 * auVar24[0x1a];
        bVar3 = (bool)((byte)(uVar11 >> 0x1b) & 1);
        auVar32[0x1b] = bVar3 * auVar33[0x1b] | !bVar3 * auVar24[0x1b];
        bVar3 = (bool)((byte)(uVar11 >> 0x1c) & 1);
        auVar32[0x1c] = bVar3 * auVar33[0x1c] | !bVar3 * auVar24[0x1c];
        bVar3 = (bool)((byte)(uVar11 >> 0x1d) & 1);
        auVar32[0x1d] = bVar3 * auVar33[0x1d] | !bVar3 * auVar24[0x1d];
        bVar3 = (bool)((byte)(uVar11 >> 0x1e) & 1);
        auVar32[0x1e] = bVar3 * auVar33[0x1e] | !bVar3 * auVar24[0x1e];
        bVar3 = (bool)((byte)(uVar11 >> 0x1f) & 1);
        auVar32[0x1f] = bVar3 * auVar33[0x1f] | !bVar3 * auVar24[0x1f];
        bVar7 = (byte)(uVar11 >> 0x20);
        auVar32[0x20] = (bVar7 & 1) * auVar33[0x20] | !(bool)(bVar7 & 1) * auVar24[0x20];
        bVar3 = (bool)((byte)(uVar11 >> 0x21) & 1);
        auVar32[0x21] = bVar3 * auVar33[0x21] | !bVar3 * auVar24[0x21];
        bVar3 = (bool)((byte)(uVar11 >> 0x22) & 1);
        auVar32[0x22] = bVar3 * auVar33[0x22] | !bVar3 * auVar24[0x22];
        bVar3 = (bool)((byte)(uVar11 >> 0x23) & 1);
        auVar32[0x23] = bVar3 * auVar33[0x23] | !bVar3 * auVar24[0x23];
        bVar3 = (bool)((byte)(uVar11 >> 0x24) & 1);
        auVar32[0x24] = bVar3 * auVar33[0x24] | !bVar3 * auVar24[0x24];
        bVar3 = (bool)((byte)(uVar11 >> 0x25) & 1);
        auVar32[0x25] = bVar3 * auVar33[0x25] | !bVar3 * auVar24[0x25];
        bVar3 = (bool)((byte)(uVar11 >> 0x26) & 1);
        auVar32[0x26] = bVar3 * auVar33[0x26] | !bVar3 * auVar24[0x26];
        bVar3 = (bool)((byte)(uVar11 >> 0x27) & 1);
        auVar32[0x27] = bVar3 * auVar33[0x27] | !bVar3 * auVar24[0x27];
        bVar8 = (byte)(uVar11 >> 0x28);
        auVar32[0x28] = (bVar8 & 1) * auVar33[0x28] | !(bool)(bVar8 & 1) * auVar24[0x28];
        bVar3 = (bool)((byte)(uVar11 >> 0x29) & 1);
        auVar32[0x29] = bVar3 * auVar33[0x29] | !bVar3 * auVar24[0x29];
        bVar3 = (bool)((byte)(uVar11 >> 0x2a) & 1);
        auVar32[0x2a] = bVar3 * auVar33[0x2a] | !bVar3 * auVar24[0x2a];
        bVar3 = (bool)((byte)(uVar11 >> 0x2b) & 1);
        auVar32[0x2b] = bVar3 * auVar33[0x2b] | !bVar3 * auVar24[0x2b];
        bVar3 = (bool)((byte)(uVar11 >> 0x2c) & 1);
        auVar32[0x2c] = bVar3 * auVar33[0x2c] | !bVar3 * auVar24[0x2c];
        bVar3 = (bool)((byte)(uVar11 >> 0x2d) & 1);
        auVar32[0x2d] = bVar3 * auVar33[0x2d] | !bVar3 * auVar24[0x2d];
        bVar3 = (bool)((byte)(uVar11 >> 0x2e) & 1);
        auVar32[0x2e] = bVar3 * auVar33[0x2e] | !bVar3 * auVar24[0x2e];
        bVar3 = (bool)((byte)(uVar11 >> 0x2f) & 1);
        auVar32[0x2f] = bVar3 * auVar33[0x2f] | !bVar3 * auVar24[0x2f];
        bVar9 = (byte)(uVar11 >> 0x30);
        auVar32[0x30] = (bVar9 & 1) * auVar33[0x30] | !(bool)(bVar9 & 1) * auVar24[0x30];
        bVar3 = (bool)((byte)(uVar11 >> 0x31) & 1);
        auVar32[0x31] = bVar3 * auVar33[0x31] | !bVar3 * auVar24[0x31];
        bVar3 = (bool)((byte)(uVar11 >> 0x32) & 1);
        auVar32[0x32] = bVar3 * auVar33[0x32] | !bVar3 * auVar24[0x32];
        bVar3 = (bool)((byte)(uVar11 >> 0x33) & 1);
        auVar32[0x33] = bVar3 * auVar33[0x33] | !bVar3 * auVar24[0x33];
        bVar3 = (bool)((byte)(uVar11 >> 0x34) & 1);
        auVar32[0x34] = bVar3 * auVar33[0x34] | !bVar3 * auVar24[0x34];
        bVar3 = (bool)((byte)(uVar11 >> 0x35) & 1);
        auVar32[0x35] = bVar3 * auVar33[0x35] | !bVar3 * auVar24[0x35];
        bVar3 = (bool)((byte)(uVar11 >> 0x36) & 1);
        auVar32[0x36] = bVar3 * auVar33[0x36] | !bVar3 * auVar24[0x36];
        bVar3 = (bool)((byte)(uVar11 >> 0x37) & 1);
        auVar32[0x37] = bVar3 * auVar33[0x37] | !bVar3 * auVar24[0x37];
        bVar10 = (byte)(uVar11 >> 0x38);
        auVar32[0x38] = (bVar10 & 1) * auVar33[0x38] | !(bool)(bVar10 & 1) * auVar24[0x38];
        bVar3 = (bool)(bVar10 >> 1 & 1);
        auVar32[0x39] = bVar3 * auVar33[0x39] | !bVar3 * auVar24[0x39];
        bVar3 = (bool)(bVar10 >> 2 & 1);
        auVar32[0x3a] = bVar3 * auVar33[0x3a] | !bVar3 * auVar24[0x3a];
        bVar3 = (bool)(bVar10 >> 3 & 1);
        auVar32[0x3b] = bVar3 * auVar33[0x3b] | !bVar3 * auVar24[0x3b];
        bVar3 = (bool)(bVar10 >> 4 & 1);
        auVar32[0x3c] = bVar3 * auVar33[0x3c] | !bVar3 * auVar24[0x3c];
        bVar3 = (bool)(bVar10 >> 5 & 1);
        auVar32[0x3d] = bVar3 * auVar33[0x3d] | !bVar3 * auVar24[0x3d];
        bVar3 = (bool)(bVar10 >> 6 & 1);
        auVar32[0x3e] = bVar3 * auVar33[0x3e] | !bVar3 * auVar24[0x3e];
        cVar12 = (char)bVar10 >> 7;
        auVar32[0x3f] = -cVar12 * auVar33[0x3f] | !(bool)-cVar12 * auVar24[0x3f];
        auVar24 = vmovdqa64_avx512f(auVar32);
        auVar32 = vmovdqa64_avx512f(auVar25);
        auVar33 = vmovdqa64_avx512f(auVar1);
        auVar25 = vmovdqa64_avx512f(auVar32);
        auVar33 = vmovdqa64_avx512f(auVar33);
        auVar32 = vmovdqa64_avx512f(auVar32);
        auVar32 = vmovdqa64_avx512f(auVar32);
        auVar32 = vmovdqa64_avx512f(auVar32);
        auVar33 = vmovdqa64_avx512f(auVar33);
        auVar33 = vmovdqa64_avx512f(auVar33);
        auVar25 = vmovdqa64_avx512f(auVar25);
        auVar25 = vmovdqa64_avx512f(auVar25);
        auVar25 = vmovdqa64_avx512f(auVar25);
        auVar33 = vmovdqa64_avx512f(auVar33);
        auVar32 = vmovdqa64_avx512f(auVar32);
        auVar25 = vmovdqa64_avx512f(auVar25);
        auVar33 = vmovdqa64_avx512f(auVar33);
        auVar32 = vmovdqa64_avx512f(auVar32);
        auVar33 = vmovdqa64_avx512f(auVar33);
        auVar32 = vmovdqa64_avx512f(auVar32);
        auVar33 = vmovdqa64_avx512f(auVar33);
        auVar32 = vmovdqa64_avx512f(auVar32);
        auVar32 = vmovdqa64_avx512f(auVar32);
        auVar32 = vmovdqa64_avx512f(auVar32);
        auVar33 = vmovdqa64_avx512f(auVar33);
        auVar33 = vmovdqa64_avx512f(auVar33);
        auVar33 = vmovdqa64_avx512f(auVar33);
        auVar32 = vmovdqa64_avx512f(auVar32);
        auVar33 = vmovdqa64_avx512f(auVar33);
        auVar32 = vmovdqa64_avx512f(auVar32);
        auVar33 = vmovdqa64_avx512f(auVar33);
        auVar32 = vmovdqa64_avx512f(auVar32);
        auVar25 = vmovdqa64_avx512f(auVar25);
        auVar33 = vpsubb_avx512bw(auVar33,auVar32);
        auVar34[0] = (bVar2 & 1) * auVar33[0] | !(bool)(bVar2 & 1) * auVar25[0];
        bVar3 = (bool)((byte)(uVar11 >> 1) & 1);
        auVar34[1] = bVar3 * auVar33[1] | !bVar3 * auVar25[1];
        bVar3 = (bool)((byte)(uVar11 >> 2) & 1);
        auVar34[2] = bVar3 * auVar33[2] | !bVar3 * auVar25[2];
        bVar3 = (bool)((byte)(uVar11 >> 3) & 1);
        auVar34[3] = bVar3 * auVar33[3] | !bVar3 * auVar25[3];
        bVar3 = (bool)((byte)(uVar11 >> 4) & 1);
        auVar34[4] = bVar3 * auVar33[4] | !bVar3 * auVar25[4];
        bVar3 = (bool)((byte)(uVar11 >> 5) & 1);
        auVar34[5] = bVar3 * auVar33[5] | !bVar3 * auVar25[5];
        bVar3 = (bool)((byte)(uVar11 >> 6) & 1);
        auVar34[6] = bVar3 * auVar33[6] | !bVar3 * auVar25[6];
        bVar3 = (bool)((byte)(uVar11 >> 7) & 1);
        auVar34[7] = bVar3 * auVar33[7] | !bVar3 * auVar25[7];
        auVar34[8] = (bVar4 & 1) * auVar33[8] | !(bool)(bVar4 & 1) * auVar25[8];
        bVar3 = (bool)((byte)(uVar11 >> 9) & 1);
        auVar34[9] = bVar3 * auVar33[9] | !bVar3 * auVar25[9];
        bVar3 = (bool)((byte)(uVar11 >> 10) & 1);
        auVar34[10] = bVar3 * auVar33[10] | !bVar3 * auVar25[10];
        bVar3 = (bool)((byte)(uVar11 >> 0xb) & 1);
        auVar34[0xb] = bVar3 * auVar33[0xb] | !bVar3 * auVar25[0xb];
        bVar3 = (bool)((byte)(uVar11 >> 0xc) & 1);
        auVar34[0xc] = bVar3 * auVar33[0xc] | !bVar3 * auVar25[0xc];
        bVar3 = (bool)((byte)(uVar11 >> 0xd) & 1);
        auVar34[0xd] = bVar3 * auVar33[0xd] | !bVar3 * auVar25[0xd];
        bVar3 = (bool)((byte)(uVar11 >> 0xe) & 1);
        auVar34[0xe] = bVar3 * auVar33[0xe] | !bVar3 * auVar25[0xe];
        bVar3 = (bool)((byte)(uVar11 >> 0xf) & 1);
        auVar34[0xf] = bVar3 * auVar33[0xf] | !bVar3 * auVar25[0xf];
        auVar34[0x10] = (bVar5 & 1) * auVar33[0x10] | !(bool)(bVar5 & 1) * auVar25[0x10];
        bVar3 = (bool)((byte)(uVar11 >> 0x11) & 1);
        auVar34[0x11] = bVar3 * auVar33[0x11] | !bVar3 * auVar25[0x11];
        bVar3 = (bool)((byte)(uVar11 >> 0x12) & 1);
        auVar34[0x12] = bVar3 * auVar33[0x12] | !bVar3 * auVar25[0x12];
        bVar3 = (bool)((byte)(uVar11 >> 0x13) & 1);
        auVar34[0x13] = bVar3 * auVar33[0x13] | !bVar3 * auVar25[0x13];
        bVar3 = (bool)((byte)(uVar11 >> 0x14) & 1);
        auVar34[0x14] = bVar3 * auVar33[0x14] | !bVar3 * auVar25[0x14];
        bVar3 = (bool)((byte)(uVar11 >> 0x15) & 1);
        auVar34[0x15] = bVar3 * auVar33[0x15] | !bVar3 * auVar25[0x15];
        bVar3 = (bool)((byte)(uVar11 >> 0x16) & 1);
        auVar34[0x16] = bVar3 * auVar33[0x16] | !bVar3 * auVar25[0x16];
        bVar3 = (bool)((byte)(uVar11 >> 0x17) & 1);
        auVar34[0x17] = bVar3 * auVar33[0x17] | !bVar3 * auVar25[0x17];
        auVar34[0x18] = (bVar6 & 1) * auVar33[0x18] | !(bool)(bVar6 & 1) * auVar25[0x18];
        bVar3 = (bool)((byte)(uVar11 >> 0x19) & 1);
        auVar34[0x19] = bVar3 * auVar33[0x19] | !bVar3 * auVar25[0x19];
        bVar3 = (bool)((byte)(uVar11 >> 0x1a) & 1);
        auVar34[0x1a] = bVar3 * auVar33[0x1a] | !bVar3 * auVar25[0x1a];
        bVar3 = (bool)((byte)(uVar11 >> 0x1b) & 1);
        auVar34[0x1b] = bVar3 * auVar33[0x1b] | !bVar3 * auVar25[0x1b];
        bVar3 = (bool)((byte)(uVar11 >> 0x1c) & 1);
        auVar34[0x1c] = bVar3 * auVar33[0x1c] | !bVar3 * auVar25[0x1c];
        bVar3 = (bool)((byte)(uVar11 >> 0x1d) & 1);
        auVar34[0x1d] = bVar3 * auVar33[0x1d] | !bVar3 * auVar25[0x1d];
        bVar3 = (bool)((byte)(uVar11 >> 0x1e) & 1);
        auVar34[0x1e] = bVar3 * auVar33[0x1e] | !bVar3 * auVar25[0x1e];
        bVar3 = (bool)((byte)(uVar11 >> 0x1f) & 1);
        auVar34[0x1f] = bVar3 * auVar33[0x1f] | !bVar3 * auVar25[0x1f];
        auVar34[0x20] = (bVar7 & 1) * auVar33[0x20] | !(bool)(bVar7 & 1) * auVar25[0x20];
        bVar3 = (bool)((byte)(uVar11 >> 0x21) & 1);
        auVar34[0x21] = bVar3 * auVar33[0x21] | !bVar3 * auVar25[0x21];
        bVar3 = (bool)((byte)(uVar11 >> 0x22) & 1);
        auVar34[0x22] = bVar3 * auVar33[0x22] | !bVar3 * auVar25[0x22];
        bVar3 = (bool)((byte)(uVar11 >> 0x23) & 1);
        auVar34[0x23] = bVar3 * auVar33[0x23] | !bVar3 * auVar25[0x23];
        bVar3 = (bool)((byte)(uVar11 >> 0x24) & 1);
        auVar34[0x24] = bVar3 * auVar33[0x24] | !bVar3 * auVar25[0x24];
        bVar3 = (bool)((byte)(uVar11 >> 0x25) & 1);
        auVar34[0x25] = bVar3 * auVar33[0x25] | !bVar3 * auVar25[0x25];
        bVar3 = (bool)((byte)(uVar11 >> 0x26) & 1);
        auVar34[0x26] = bVar3 * auVar33[0x26] | !bVar3 * auVar25[0x26];
        bVar3 = (bool)((byte)(uVar11 >> 0x27) & 1);
        auVar34[0x27] = bVar3 * auVar33[0x27] | !bVar3 * auVar25[0x27];
        auVar34[0x28] = (bVar8 & 1) * auVar33[0x28] | !(bool)(bVar8 & 1) * auVar25[0x28];
        bVar3 = (bool)((byte)(uVar11 >> 0x29) & 1);
        auVar34[0x29] = bVar3 * auVar33[0x29] | !bVar3 * auVar25[0x29];
        bVar3 = (bool)((byte)(uVar11 >> 0x2a) & 1);
        auVar34[0x2a] = bVar3 * auVar33[0x2a] | !bVar3 * auVar25[0x2a];
        bVar3 = (bool)((byte)(uVar11 >> 0x2b) & 1);
        auVar34[0x2b] = bVar3 * auVar33[0x2b] | !bVar3 * auVar25[0x2b];
        bVar3 = (bool)((byte)(uVar11 >> 0x2c) & 1);
        auVar34[0x2c] = bVar3 * auVar33[0x2c] | !bVar3 * auVar25[0x2c];
        bVar3 = (bool)((byte)(uVar11 >> 0x2d) & 1);
        auVar34[0x2d] = bVar3 * auVar33[0x2d] | !bVar3 * auVar25[0x2d];
        bVar3 = (bool)((byte)(uVar11 >> 0x2e) & 1);
        auVar34[0x2e] = bVar3 * auVar33[0x2e] | !bVar3 * auVar25[0x2e];
        bVar3 = (bool)((byte)(uVar11 >> 0x2f) & 1);
        auVar34[0x2f] = bVar3 * auVar33[0x2f] | !bVar3 * auVar25[0x2f];
        auVar34[0x30] = (bVar9 & 1) * auVar33[0x30] | !(bool)(bVar9 & 1) * auVar25[0x30];
        bVar3 = (bool)((byte)(uVar11 >> 0x31) & 1);
        auVar34[0x31] = bVar3 * auVar33[0x31] | !bVar3 * auVar25[0x31];
        bVar3 = (bool)((byte)(uVar11 >> 0x32) & 1);
        auVar34[0x32] = bVar3 * auVar33[0x32] | !bVar3 * auVar25[0x32];
        bVar3 = (bool)((byte)(uVar11 >> 0x33) & 1);
        auVar34[0x33] = bVar3 * auVar33[0x33] | !bVar3 * auVar25[0x33];
        bVar3 = (bool)((byte)(uVar11 >> 0x34) & 1);
        auVar34[0x34] = bVar3 * auVar33[0x34] | !bVar3 * auVar25[0x34];
        bVar3 = (bool)((byte)(uVar11 >> 0x35) & 1);
        auVar34[0x35] = bVar3 * auVar33[0x35] | !bVar3 * auVar25[0x35];
        bVar3 = (bool)((byte)(uVar11 >> 0x36) & 1);
        auVar34[0x36] = bVar3 * auVar33[0x36] | !bVar3 * auVar25[0x36];
        bVar3 = (bool)((byte)(uVar11 >> 0x37) & 1);
        auVar34[0x37] = bVar3 * auVar33[0x37] | !bVar3 * auVar25[0x37];
        auVar34[0x38] = (bVar10 & 1) * auVar33[0x38] | !(bool)(bVar10 & 1) * auVar25[0x38];
        bVar3 = (bool)(bVar10 >> 1 & 1);
        auVar34[0x39] = bVar3 * auVar33[0x39] | !bVar3 * auVar25[0x39];
        bVar3 = (bool)(bVar10 >> 2 & 1);
        auVar34[0x3a] = bVar3 * auVar33[0x3a] | !bVar3 * auVar25[0x3a];
        bVar3 = (bool)(bVar10 >> 3 & 1);
        auVar34[0x3b] = bVar3 * auVar33[0x3b] | !bVar3 * auVar25[0x3b];
        bVar3 = (bool)(bVar10 >> 4 & 1);
        auVar34[0x3c] = bVar3 * auVar33[0x3c] | !bVar3 * auVar25[0x3c];
        bVar3 = (bool)(bVar10 >> 5 & 1);
        auVar34[0x3d] = bVar3 * auVar33[0x3d] | !bVar3 * auVar25[0x3d];
        bVar3 = (bool)(bVar10 >> 6 & 1);
        auVar34[0x3e] = bVar3 * auVar33[0x3e] | !bVar3 * auVar25[0x3e];
        auVar34[0x3f] = -cVar12 * auVar33[0x3f] | !(bool)-cVar12 * auVar25[0x3f];
        auVar25 = vmovdqa64_avx512f(auVar34);
        auVar32 = vmovdqa64_avx512f(auVar26);
        auVar33 = vmovdqa64_avx512f(auVar1);
        auVar26 = vmovdqa64_avx512f(auVar32);
        auVar33 = vmovdqa64_avx512f(auVar33);
        auVar32 = vmovdqa64_avx512f(auVar32);
        auVar32 = vmovdqa64_avx512f(auVar32);
        auVar32 = vmovdqa64_avx512f(auVar32);
        auVar33 = vmovdqa64_avx512f(auVar33);
        auVar33 = vmovdqa64_avx512f(auVar33);
        auVar26 = vmovdqa64_avx512f(auVar26);
        auVar26 = vmovdqa64_avx512f(auVar26);
        auVar26 = vmovdqa64_avx512f(auVar26);
        auVar33 = vmovdqa64_avx512f(auVar33);
        auVar32 = vmovdqa64_avx512f(auVar32);
        auVar26 = vmovdqa64_avx512f(auVar26);
        auVar33 = vmovdqa64_avx512f(auVar33);
        auVar32 = vmovdqa64_avx512f(auVar32);
        auVar33 = vmovdqa64_avx512f(auVar33);
        auVar32 = vmovdqa64_avx512f(auVar32);
        auVar33 = vmovdqa64_avx512f(auVar33);
        auVar32 = vmovdqa64_avx512f(auVar32);
        auVar32 = vmovdqa64_avx512f(auVar32);
        auVar32 = vmovdqa64_avx512f(auVar32);
        auVar33 = vmovdqa64_avx512f(auVar33);
        auVar33 = vmovdqa64_avx512f(auVar33);
        auVar33 = vmovdqa64_avx512f(auVar33);
        auVar32 = vmovdqa64_avx512f(auVar32);
        auVar33 = vmovdqa64_avx512f(auVar33);
        auVar32 = vmovdqa64_avx512f(auVar32);
        auVar33 = vmovdqa64_avx512f(auVar33);
        auVar32 = vmovdqa64_avx512f(auVar32);
        auVar26 = vmovdqa64_avx512f(auVar26);
        auVar32 = vpsubb_avx512bw(auVar33,auVar32);
        auVar33[0] = (bVar2 & 1) * auVar32[0] | !(bool)(bVar2 & 1) * auVar26[0];
        bVar3 = (bool)((byte)(uVar11 >> 1) & 1);
        auVar33[1] = bVar3 * auVar32[1] | !bVar3 * auVar26[1];
        bVar3 = (bool)((byte)(uVar11 >> 2) & 1);
        auVar33[2] = bVar3 * auVar32[2] | !bVar3 * auVar26[2];
        bVar3 = (bool)((byte)(uVar11 >> 3) & 1);
        auVar33[3] = bVar3 * auVar32[3] | !bVar3 * auVar26[3];
        bVar3 = (bool)((byte)(uVar11 >> 4) & 1);
        auVar33[4] = bVar3 * auVar32[4] | !bVar3 * auVar26[4];
        bVar3 = (bool)((byte)(uVar11 >> 5) & 1);
        auVar33[5] = bVar3 * auVar32[5] | !bVar3 * auVar26[5];
        bVar3 = (bool)((byte)(uVar11 >> 6) & 1);
        auVar33[6] = bVar3 * auVar32[6] | !bVar3 * auVar26[6];
        bVar3 = (bool)((byte)(uVar11 >> 7) & 1);
        auVar33[7] = bVar3 * auVar32[7] | !bVar3 * auVar26[7];
        auVar33[8] = (bVar4 & 1) * auVar32[8] | !(bool)(bVar4 & 1) * auVar26[8];
        bVar3 = (bool)((byte)(uVar11 >> 9) & 1);
        auVar33[9] = bVar3 * auVar32[9] | !bVar3 * auVar26[9];
        bVar3 = (bool)((byte)(uVar11 >> 10) & 1);
        auVar33[10] = bVar3 * auVar32[10] | !bVar3 * auVar26[10];
        bVar3 = (bool)((byte)(uVar11 >> 0xb) & 1);
        auVar33[0xb] = bVar3 * auVar32[0xb] | !bVar3 * auVar26[0xb];
        bVar3 = (bool)((byte)(uVar11 >> 0xc) & 1);
        auVar33[0xc] = bVar3 * auVar32[0xc] | !bVar3 * auVar26[0xc];
        bVar3 = (bool)((byte)(uVar11 >> 0xd) & 1);
        auVar33[0xd] = bVar3 * auVar32[0xd] | !bVar3 * auVar26[0xd];
        bVar3 = (bool)((byte)(uVar11 >> 0xe) & 1);
        auVar33[0xe] = bVar3 * auVar32[0xe] | !bVar3 * auVar26[0xe];
        bVar3 = (bool)((byte)(uVar11 >> 0xf) & 1);
        auVar33[0xf] = bVar3 * auVar32[0xf] | !bVar3 * auVar26[0xf];
        auVar33[0x10] = (bVar5 & 1) * auVar32[0x10] | !(bool)(bVar5 & 1) * auVar26[0x10];
        bVar3 = (bool)((byte)(uVar11 >> 0x11) & 1);
        auVar33[0x11] = bVar3 * auVar32[0x11] | !bVar3 * auVar26[0x11];
        bVar3 = (bool)((byte)(uVar11 >> 0x12) & 1);
        auVar33[0x12] = bVar3 * auVar32[0x12] | !bVar3 * auVar26[0x12];
        bVar3 = (bool)((byte)(uVar11 >> 0x13) & 1);
        auVar33[0x13] = bVar3 * auVar32[0x13] | !bVar3 * auVar26[0x13];
        bVar3 = (bool)((byte)(uVar11 >> 0x14) & 1);
        auVar33[0x14] = bVar3 * auVar32[0x14] | !bVar3 * auVar26[0x14];
        bVar3 = (bool)((byte)(uVar11 >> 0x15) & 1);
        auVar33[0x15] = bVar3 * auVar32[0x15] | !bVar3 * auVar26[0x15];
        bVar3 = (bool)((byte)(uVar11 >> 0x16) & 1);
        auVar33[0x16] = bVar3 * auVar32[0x16] | !bVar3 * auVar26[0x16];
        bVar3 = (bool)((byte)(uVar11 >> 0x17) & 1);
        auVar33[0x17] = bVar3 * auVar32[0x17] | !bVar3 * auVar26[0x17];
        auVar33[0x18] = (bVar6 & 1) * auVar32[0x18] | !(bool)(bVar6 & 1) * auVar26[0x18];
        bVar3 = (bool)((byte)(uVar11 >> 0x19) & 1);
        auVar33[0x19] = bVar3 * auVar32[0x19] | !bVar3 * auVar26[0x19];
        bVar3 = (bool)((byte)(uVar11 >> 0x1a) & 1);
        auVar33[0x1a] = bVar3 * auVar32[0x1a] | !bVar3 * auVar26[0x1a];
        bVar3 = (bool)((byte)(uVar11 >> 0x1b) & 1);
        auVar33[0x1b] = bVar3 * auVar32[0x1b] | !bVar3 * auVar26[0x1b];
        bVar3 = (bool)((byte)(uVar11 >> 0x1c) & 1);
        auVar33[0x1c] = bVar3 * auVar32[0x1c] | !bVar3 * auVar26[0x1c];
        bVar3 = (bool)((byte)(uVar11 >> 0x1d) & 1);
        auVar33[0x1d] = bVar3 * auVar32[0x1d] | !bVar3 * auVar26[0x1d];
        bVar3 = (bool)((byte)(uVar11 >> 0x1e) & 1);
        auVar33[0x1e] = bVar3 * auVar32[0x1e] | !bVar3 * auVar26[0x1e];
        bVar3 = (bool)((byte)(uVar11 >> 0x1f) & 1);
        auVar33[0x1f] = bVar3 * auVar32[0x1f] | !bVar3 * auVar26[0x1f];
        auVar33[0x20] = (bVar7 & 1) * auVar32[0x20] | !(bool)(bVar7 & 1) * auVar26[0x20];
        bVar3 = (bool)((byte)(uVar11 >> 0x21) & 1);
        auVar33[0x21] = bVar3 * auVar32[0x21] | !bVar3 * auVar26[0x21];
        bVar3 = (bool)((byte)(uVar11 >> 0x22) & 1);
        auVar33[0x22] = bVar3 * auVar32[0x22] | !bVar3 * auVar26[0x22];
        bVar3 = (bool)((byte)(uVar11 >> 0x23) & 1);
        auVar33[0x23] = bVar3 * auVar32[0x23] | !bVar3 * auVar26[0x23];
        bVar3 = (bool)((byte)(uVar11 >> 0x24) & 1);
        auVar33[0x24] = bVar3 * auVar32[0x24] | !bVar3 * auVar26[0x24];
        bVar3 = (bool)((byte)(uVar11 >> 0x25) & 1);
        auVar33[0x25] = bVar3 * auVar32[0x25] | !bVar3 * auVar26[0x25];
        bVar3 = (bool)((byte)(uVar11 >> 0x26) & 1);
        auVar33[0x26] = bVar3 * auVar32[0x26] | !bVar3 * auVar26[0x26];
        bVar3 = (bool)((byte)(uVar11 >> 0x27) & 1);
        auVar33[0x27] = bVar3 * auVar32[0x27] | !bVar3 * auVar26[0x27];
        auVar33[0x28] = (bVar8 & 1) * auVar32[0x28] | !(bool)(bVar8 & 1) * auVar26[0x28];
        bVar3 = (bool)((byte)(uVar11 >> 0x29) & 1);
        auVar33[0x29] = bVar3 * auVar32[0x29] | !bVar3 * auVar26[0x29];
        bVar3 = (bool)((byte)(uVar11 >> 0x2a) & 1);
        auVar33[0x2a] = bVar3 * auVar32[0x2a] | !bVar3 * auVar26[0x2a];
        bVar3 = (bool)((byte)(uVar11 >> 0x2b) & 1);
        auVar33[0x2b] = bVar3 * auVar32[0x2b] | !bVar3 * auVar26[0x2b];
        bVar3 = (bool)((byte)(uVar11 >> 0x2c) & 1);
        auVar33[0x2c] = bVar3 * auVar32[0x2c] | !bVar3 * auVar26[0x2c];
        bVar3 = (bool)((byte)(uVar11 >> 0x2d) & 1);
        auVar33[0x2d] = bVar3 * auVar32[0x2d] | !bVar3 * auVar26[0x2d];
        bVar3 = (bool)((byte)(uVar11 >> 0x2e) & 1);
        auVar33[0x2e] = bVar3 * auVar32[0x2e] | !bVar3 * auVar26[0x2e];
        bVar3 = (bool)((byte)(uVar11 >> 0x2f) & 1);
        auVar33[0x2f] = bVar3 * auVar32[0x2f] | !bVar3 * auVar26[0x2f];
        auVar33[0x30] = (bVar9 & 1) * auVar32[0x30] | !(bool)(bVar9 & 1) * auVar26[0x30];
        bVar3 = (bool)((byte)(uVar11 >> 0x31) & 1);
        auVar33[0x31] = bVar3 * auVar32[0x31] | !bVar3 * auVar26[0x31];
        bVar3 = (bool)((byte)(uVar11 >> 0x32) & 1);
        auVar33[0x32] = bVar3 * auVar32[0x32] | !bVar3 * auVar26[0x32];
        bVar3 = (bool)((byte)(uVar11 >> 0x33) & 1);
        auVar33[0x33] = bVar3 * auVar32[0x33] | !bVar3 * auVar26[0x33];
        bVar3 = (bool)((byte)(uVar11 >> 0x34) & 1);
        auVar33[0x34] = bVar3 * auVar32[0x34] | !bVar3 * auVar26[0x34];
        bVar3 = (bool)((byte)(uVar11 >> 0x35) & 1);
        auVar33[0x35] = bVar3 * auVar32[0x35] | !bVar3 * auVar26[0x35];
        bVar3 = (bool)((byte)(uVar11 >> 0x36) & 1);
        auVar33[0x36] = bVar3 * auVar32[0x36] | !bVar3 * auVar26[0x36];
        bVar3 = (bool)((byte)(uVar11 >> 0x37) & 1);
        auVar33[0x37] = bVar3 * auVar32[0x37] | !bVar3 * auVar26[0x37];
        auVar33[0x38] = (bVar10 & 1) * auVar32[0x38] | !(bool)(bVar10 & 1) * auVar26[0x38];
        bVar3 = (bool)(bVar10 >> 1 & 1);
        auVar33[0x39] = bVar3 * auVar32[0x39] | !bVar3 * auVar26[0x39];
        bVar3 = (bool)(bVar10 >> 2 & 1);
        auVar33[0x3a] = bVar3 * auVar32[0x3a] | !bVar3 * auVar26[0x3a];
        bVar3 = (bool)(bVar10 >> 3 & 1);
        auVar33[0x3b] = bVar3 * auVar32[0x3b] | !bVar3 * auVar26[0x3b];
        bVar3 = (bool)(bVar10 >> 4 & 1);
        auVar33[0x3c] = bVar3 * auVar32[0x3c] | !bVar3 * auVar26[0x3c];
        bVar3 = (bool)(bVar10 >> 5 & 1);
        auVar33[0x3d] = bVar3 * auVar32[0x3d] | !bVar3 * auVar26[0x3d];
        bVar3 = (bool)(bVar10 >> 6 & 1);
        auVar33[0x3e] = bVar3 * auVar32[0x3e] | !bVar3 * auVar26[0x3e];
        auVar33[0x3f] = -cVar12 * auVar32[0x3f] | !(bool)-cVar12 * auVar26[0x3f];
        auVar26 = vmovdqa64_avx512f(auVar33);
        auVar32 = vmovdqa64_avx512f(auVar27);
        auVar33 = vmovdqa64_avx512f(auVar1);
        auVar27 = vmovdqa64_avx512f(auVar32);
        auVar33 = vmovdqa64_avx512f(auVar33);
        auVar32 = vmovdqa64_avx512f(auVar32);
        auVar32 = vmovdqa64_avx512f(auVar32);
        auVar32 = vmovdqa64_avx512f(auVar32);
        auVar33 = vmovdqa64_avx512f(auVar33);
        auVar33 = vmovdqa64_avx512f(auVar33);
        auVar27 = vmovdqa64_avx512f(auVar27);
        auVar27 = vmovdqa64_avx512f(auVar27);
        auVar27 = vmovdqa64_avx512f(auVar27);
        auVar33 = vmovdqa64_avx512f(auVar33);
        auVar32 = vmovdqa64_avx512f(auVar32);
        auVar27 = vmovdqa64_avx512f(auVar27);
        auVar33 = vmovdqa64_avx512f(auVar33);
        auVar32 = vmovdqa64_avx512f(auVar32);
        auVar33 = vmovdqa64_avx512f(auVar33);
        auVar32 = vmovdqa64_avx512f(auVar32);
        auVar33 = vmovdqa64_avx512f(auVar33);
        auVar32 = vmovdqa64_avx512f(auVar32);
        auVar32 = vmovdqa64_avx512f(auVar32);
        auVar32 = vmovdqa64_avx512f(auVar32);
        auVar33 = vmovdqa64_avx512f(auVar33);
        auVar33 = vmovdqa64_avx512f(auVar33);
        auVar33 = vmovdqa64_avx512f(auVar33);
        auVar32 = vmovdqa64_avx512f(auVar32);
        auVar33 = vmovdqa64_avx512f(auVar33);
        auVar32 = vmovdqa64_avx512f(auVar32);
        auVar33 = vmovdqa64_avx512f(auVar33);
        auVar32 = vmovdqa64_avx512f(auVar32);
        auVar27 = vmovdqa64_avx512f(auVar27);
        auVar33 = vpsubb_avx512bw(auVar33,auVar32);
        auVar35[0] = (bVar2 & 1) * auVar33[0] | !(bool)(bVar2 & 1) * auVar27[0];
        bVar3 = (bool)((byte)(uVar11 >> 1) & 1);
        auVar35[1] = bVar3 * auVar33[1] | !bVar3 * auVar27[1];
        bVar3 = (bool)((byte)(uVar11 >> 2) & 1);
        auVar35[2] = bVar3 * auVar33[2] | !bVar3 * auVar27[2];
        bVar3 = (bool)((byte)(uVar11 >> 3) & 1);
        auVar35[3] = bVar3 * auVar33[3] | !bVar3 * auVar27[3];
        bVar3 = (bool)((byte)(uVar11 >> 4) & 1);
        auVar35[4] = bVar3 * auVar33[4] | !bVar3 * auVar27[4];
        bVar3 = (bool)((byte)(uVar11 >> 5) & 1);
        auVar35[5] = bVar3 * auVar33[5] | !bVar3 * auVar27[5];
        bVar3 = (bool)((byte)(uVar11 >> 6) & 1);
        auVar35[6] = bVar3 * auVar33[6] | !bVar3 * auVar27[6];
        bVar3 = (bool)((byte)(uVar11 >> 7) & 1);
        auVar35[7] = bVar3 * auVar33[7] | !bVar3 * auVar27[7];
        auVar35[8] = (bVar4 & 1) * auVar33[8] | !(bool)(bVar4 & 1) * auVar27[8];
        bVar3 = (bool)((byte)(uVar11 >> 9) & 1);
        auVar35[9] = bVar3 * auVar33[9] | !bVar3 * auVar27[9];
        bVar3 = (bool)((byte)(uVar11 >> 10) & 1);
        auVar35[10] = bVar3 * auVar33[10] | !bVar3 * auVar27[10];
        bVar3 = (bool)((byte)(uVar11 >> 0xb) & 1);
        auVar35[0xb] = bVar3 * auVar33[0xb] | !bVar3 * auVar27[0xb];
        bVar3 = (bool)((byte)(uVar11 >> 0xc) & 1);
        auVar35[0xc] = bVar3 * auVar33[0xc] | !bVar3 * auVar27[0xc];
        bVar3 = (bool)((byte)(uVar11 >> 0xd) & 1);
        auVar35[0xd] = bVar3 * auVar33[0xd] | !bVar3 * auVar27[0xd];
        bVar3 = (bool)((byte)(uVar11 >> 0xe) & 1);
        auVar35[0xe] = bVar3 * auVar33[0xe] | !bVar3 * auVar27[0xe];
        bVar3 = (bool)((byte)(uVar11 >> 0xf) & 1);
        auVar35[0xf] = bVar3 * auVar33[0xf] | !bVar3 * auVar27[0xf];
        auVar35[0x10] = (bVar5 & 1) * auVar33[0x10] | !(bool)(bVar5 & 1) * auVar27[0x10];
        bVar3 = (bool)((byte)(uVar11 >> 0x11) & 1);
        auVar35[0x11] = bVar3 * auVar33[0x11] | !bVar3 * auVar27[0x11];
        bVar3 = (bool)((byte)(uVar11 >> 0x12) & 1);
        auVar35[0x12] = bVar3 * auVar33[0x12] | !bVar3 * auVar27[0x12];
        bVar3 = (bool)((byte)(uVar11 >> 0x13) & 1);
        auVar35[0x13] = bVar3 * auVar33[0x13] | !bVar3 * auVar27[0x13];
        bVar3 = (bool)((byte)(uVar11 >> 0x14) & 1);
        auVar35[0x14] = bVar3 * auVar33[0x14] | !bVar3 * auVar27[0x14];
        bVar3 = (bool)((byte)(uVar11 >> 0x15) & 1);
        auVar35[0x15] = bVar3 * auVar33[0x15] | !bVar3 * auVar27[0x15];
        bVar3 = (bool)((byte)(uVar11 >> 0x16) & 1);
        auVar35[0x16] = bVar3 * auVar33[0x16] | !bVar3 * auVar27[0x16];
        bVar3 = (bool)((byte)(uVar11 >> 0x17) & 1);
        auVar35[0x17] = bVar3 * auVar33[0x17] | !bVar3 * auVar27[0x17];
        auVar35[0x18] = (bVar6 & 1) * auVar33[0x18] | !(bool)(bVar6 & 1) * auVar27[0x18];
        bVar3 = (bool)((byte)(uVar11 >> 0x19) & 1);
        auVar35[0x19] = bVar3 * auVar33[0x19] | !bVar3 * auVar27[0x19];
        bVar3 = (bool)((byte)(uVar11 >> 0x1a) & 1);
        auVar35[0x1a] = bVar3 * auVar33[0x1a] | !bVar3 * auVar27[0x1a];
        bVar3 = (bool)((byte)(uVar11 >> 0x1b) & 1);
        auVar35[0x1b] = bVar3 * auVar33[0x1b] | !bVar3 * auVar27[0x1b];
        bVar3 = (bool)((byte)(uVar11 >> 0x1c) & 1);
        auVar35[0x1c] = bVar3 * auVar33[0x1c] | !bVar3 * auVar27[0x1c];
        bVar3 = (bool)((byte)(uVar11 >> 0x1d) & 1);
        auVar35[0x1d] = bVar3 * auVar33[0x1d] | !bVar3 * auVar27[0x1d];
        bVar3 = (bool)((byte)(uVar11 >> 0x1e) & 1);
        auVar35[0x1e] = bVar3 * auVar33[0x1e] | !bVar3 * auVar27[0x1e];
        bVar3 = (bool)((byte)(uVar11 >> 0x1f) & 1);
        auVar35[0x1f] = bVar3 * auVar33[0x1f] | !bVar3 * auVar27[0x1f];
        auVar35[0x20] = (bVar7 & 1) * auVar33[0x20] | !(bool)(bVar7 & 1) * auVar27[0x20];
        bVar3 = (bool)((byte)(uVar11 >> 0x21) & 1);
        auVar35[0x21] = bVar3 * auVar33[0x21] | !bVar3 * auVar27[0x21];
        bVar3 = (bool)((byte)(uVar11 >> 0x22) & 1);
        auVar35[0x22] = bVar3 * auVar33[0x22] | !bVar3 * auVar27[0x22];
        bVar3 = (bool)((byte)(uVar11 >> 0x23) & 1);
        auVar35[0x23] = bVar3 * auVar33[0x23] | !bVar3 * auVar27[0x23];
        bVar3 = (bool)((byte)(uVar11 >> 0x24) & 1);
        auVar35[0x24] = bVar3 * auVar33[0x24] | !bVar3 * auVar27[0x24];
        bVar3 = (bool)((byte)(uVar11 >> 0x25) & 1);
        auVar35[0x25] = bVar3 * auVar33[0x25] | !bVar3 * auVar27[0x25];
        bVar3 = (bool)((byte)(uVar11 >> 0x26) & 1);
        auVar35[0x26] = bVar3 * auVar33[0x26] | !bVar3 * auVar27[0x26];
        bVar3 = (bool)((byte)(uVar11 >> 0x27) & 1);
        auVar35[0x27] = bVar3 * auVar33[0x27] | !bVar3 * auVar27[0x27];
        auVar35[0x28] = (bVar8 & 1) * auVar33[0x28] | !(bool)(bVar8 & 1) * auVar27[0x28];
        bVar3 = (bool)((byte)(uVar11 >> 0x29) & 1);
        auVar35[0x29] = bVar3 * auVar33[0x29] | !bVar3 * auVar27[0x29];
        bVar3 = (bool)((byte)(uVar11 >> 0x2a) & 1);
        auVar35[0x2a] = bVar3 * auVar33[0x2a] | !bVar3 * auVar27[0x2a];
        bVar3 = (bool)((byte)(uVar11 >> 0x2b) & 1);
        auVar35[0x2b] = bVar3 * auVar33[0x2b] | !bVar3 * auVar27[0x2b];
        bVar3 = (bool)((byte)(uVar11 >> 0x2c) & 1);
        auVar35[0x2c] = bVar3 * auVar33[0x2c] | !bVar3 * auVar27[0x2c];
        bVar3 = (bool)((byte)(uVar11 >> 0x2d) & 1);
        auVar35[0x2d] = bVar3 * auVar33[0x2d] | !bVar3 * auVar27[0x2d];
        bVar3 = (bool)((byte)(uVar11 >> 0x2e) & 1);
        auVar35[0x2e] = bVar3 * auVar33[0x2e] | !bVar3 * auVar27[0x2e];
        bVar3 = (bool)((byte)(uVar11 >> 0x2f) & 1);
        auVar35[0x2f] = bVar3 * auVar33[0x2f] | !bVar3 * auVar27[0x2f];
        auVar35[0x30] = (bVar9 & 1) * auVar33[0x30] | !(bool)(bVar9 & 1) * auVar27[0x30];
        bVar3 = (bool)((byte)(uVar11 >> 0x31) & 1);
        auVar35[0x31] = bVar3 * auVar33[0x31] | !bVar3 * auVar27[0x31];
        bVar3 = (bool)((byte)(uVar11 >> 0x32) & 1);
        auVar35[0x32] = bVar3 * auVar33[0x32] | !bVar3 * auVar27[0x32];
        bVar3 = (bool)((byte)(uVar11 >> 0x33) & 1);
        auVar35[0x33] = bVar3 * auVar33[0x33] | !bVar3 * auVar27[0x33];
        bVar3 = (bool)((byte)(uVar11 >> 0x34) & 1);
        auVar35[0x34] = bVar3 * auVar33[0x34] | !bVar3 * auVar27[0x34];
        bVar3 = (bool)((byte)(uVar11 >> 0x35) & 1);
        auVar35[0x35] = bVar3 * auVar33[0x35] | !bVar3 * auVar27[0x35];
        bVar3 = (bool)((byte)(uVar11 >> 0x36) & 1);
        auVar35[0x36] = bVar3 * auVar33[0x36] | !bVar3 * auVar27[0x36];
        bVar3 = (bool)((byte)(uVar11 >> 0x37) & 1);
        auVar35[0x37] = bVar3 * auVar33[0x37] | !bVar3 * auVar27[0x37];
        auVar35[0x38] = (bVar10 & 1) * auVar33[0x38] | !(bool)(bVar10 & 1) * auVar27[0x38];
        bVar3 = (bool)(bVar10 >> 1 & 1);
        auVar35[0x39] = bVar3 * auVar33[0x39] | !bVar3 * auVar27[0x39];
        bVar3 = (bool)(bVar10 >> 2 & 1);
        auVar35[0x3a] = bVar3 * auVar33[0x3a] | !bVar3 * auVar27[0x3a];
        bVar3 = (bool)(bVar10 >> 3 & 1);
        auVar35[0x3b] = bVar3 * auVar33[0x3b] | !bVar3 * auVar27[0x3b];
        bVar3 = (bool)(bVar10 >> 4 & 1);
        auVar35[0x3c] = bVar3 * auVar33[0x3c] | !bVar3 * auVar27[0x3c];
        bVar3 = (bool)(bVar10 >> 5 & 1);
        auVar35[0x3d] = bVar3 * auVar33[0x3d] | !bVar3 * auVar27[0x3d];
        bVar3 = (bool)(bVar10 >> 6 & 1);
        auVar35[0x3e] = bVar3 * auVar33[0x3e] | !bVar3 * auVar27[0x3e];
        auVar35[0x3f] = -cVar12 * auVar33[0x3f] | !(bool)-cVar12 * auVar27[0x3f];
        auVar27 = vmovdqa64_avx512f(auVar35);
        auVar32 = vmovdqa64_avx512f(auVar28);
        auVar33 = vmovdqa64_avx512f(auVar1);
        auVar28 = vmovdqa64_avx512f(auVar32);
        auVar33 = vmovdqa64_avx512f(auVar33);
        auVar32 = vmovdqa64_avx512f(auVar32);
        auVar32 = vmovdqa64_avx512f(auVar32);
        auVar32 = vmovdqa64_avx512f(auVar32);
        auVar33 = vmovdqa64_avx512f(auVar33);
        auVar33 = vmovdqa64_avx512f(auVar33);
        auVar28 = vmovdqa64_avx512f(auVar28);
        auVar28 = vmovdqa64_avx512f(auVar28);
        auVar28 = vmovdqa64_avx512f(auVar28);
        auVar33 = vmovdqa64_avx512f(auVar33);
        auVar32 = vmovdqa64_avx512f(auVar32);
        auVar28 = vmovdqa64_avx512f(auVar28);
        auVar33 = vmovdqa64_avx512f(auVar33);
        auVar32 = vmovdqa64_avx512f(auVar32);
        auVar33 = vmovdqa64_avx512f(auVar33);
        auVar32 = vmovdqa64_avx512f(auVar32);
        auVar33 = vmovdqa64_avx512f(auVar33);
        auVar32 = vmovdqa64_avx512f(auVar32);
        auVar32 = vmovdqa64_avx512f(auVar32);
        auVar32 = vmovdqa64_avx512f(auVar32);
        auVar33 = vmovdqa64_avx512f(auVar33);
        auVar33 = vmovdqa64_avx512f(auVar33);
        auVar33 = vmovdqa64_avx512f(auVar33);
        auVar32 = vmovdqa64_avx512f(auVar32);
        auVar33 = vmovdqa64_avx512f(auVar33);
        auVar32 = vmovdqa64_avx512f(auVar32);
        auVar33 = vmovdqa64_avx512f(auVar33);
        auVar32 = vmovdqa64_avx512f(auVar32);
        auVar28 = vmovdqa64_avx512f(auVar28);
        auVar33 = vpsubb_avx512bw(auVar33,auVar32);
        auVar36[0] = (bVar2 & 1) * auVar33[0] | !(bool)(bVar2 & 1) * auVar28[0];
        bVar3 = (bool)((byte)(uVar11 >> 1) & 1);
        auVar36[1] = bVar3 * auVar33[1] | !bVar3 * auVar28[1];
        bVar3 = (bool)((byte)(uVar11 >> 2) & 1);
        auVar36[2] = bVar3 * auVar33[2] | !bVar3 * auVar28[2];
        bVar3 = (bool)((byte)(uVar11 >> 3) & 1);
        auVar36[3] = bVar3 * auVar33[3] | !bVar3 * auVar28[3];
        bVar3 = (bool)((byte)(uVar11 >> 4) & 1);
        auVar36[4] = bVar3 * auVar33[4] | !bVar3 * auVar28[4];
        bVar3 = (bool)((byte)(uVar11 >> 5) & 1);
        auVar36[5] = bVar3 * auVar33[5] | !bVar3 * auVar28[5];
        bVar3 = (bool)((byte)(uVar11 >> 6) & 1);
        auVar36[6] = bVar3 * auVar33[6] | !bVar3 * auVar28[6];
        bVar3 = (bool)((byte)(uVar11 >> 7) & 1);
        auVar36[7] = bVar3 * auVar33[7] | !bVar3 * auVar28[7];
        auVar36[8] = (bVar4 & 1) * auVar33[8] | !(bool)(bVar4 & 1) * auVar28[8];
        bVar3 = (bool)((byte)(uVar11 >> 9) & 1);
        auVar36[9] = bVar3 * auVar33[9] | !bVar3 * auVar28[9];
        bVar3 = (bool)((byte)(uVar11 >> 10) & 1);
        auVar36[10] = bVar3 * auVar33[10] | !bVar3 * auVar28[10];
        bVar3 = (bool)((byte)(uVar11 >> 0xb) & 1);
        auVar36[0xb] = bVar3 * auVar33[0xb] | !bVar3 * auVar28[0xb];
        bVar3 = (bool)((byte)(uVar11 >> 0xc) & 1);
        auVar36[0xc] = bVar3 * auVar33[0xc] | !bVar3 * auVar28[0xc];
        bVar3 = (bool)((byte)(uVar11 >> 0xd) & 1);
        auVar36[0xd] = bVar3 * auVar33[0xd] | !bVar3 * auVar28[0xd];
        bVar3 = (bool)((byte)(uVar11 >> 0xe) & 1);
        auVar36[0xe] = bVar3 * auVar33[0xe] | !bVar3 * auVar28[0xe];
        bVar3 = (bool)((byte)(uVar11 >> 0xf) & 1);
        auVar36[0xf] = bVar3 * auVar33[0xf] | !bVar3 * auVar28[0xf];
        auVar36[0x10] = (bVar5 & 1) * auVar33[0x10] | !(bool)(bVar5 & 1) * auVar28[0x10];
        bVar3 = (bool)((byte)(uVar11 >> 0x11) & 1);
        auVar36[0x11] = bVar3 * auVar33[0x11] | !bVar3 * auVar28[0x11];
        bVar3 = (bool)((byte)(uVar11 >> 0x12) & 1);
        auVar36[0x12] = bVar3 * auVar33[0x12] | !bVar3 * auVar28[0x12];
        bVar3 = (bool)((byte)(uVar11 >> 0x13) & 1);
        auVar36[0x13] = bVar3 * auVar33[0x13] | !bVar3 * auVar28[0x13];
        bVar3 = (bool)((byte)(uVar11 >> 0x14) & 1);
        auVar36[0x14] = bVar3 * auVar33[0x14] | !bVar3 * auVar28[0x14];
        bVar3 = (bool)((byte)(uVar11 >> 0x15) & 1);
        auVar36[0x15] = bVar3 * auVar33[0x15] | !bVar3 * auVar28[0x15];
        bVar3 = (bool)((byte)(uVar11 >> 0x16) & 1);
        auVar36[0x16] = bVar3 * auVar33[0x16] | !bVar3 * auVar28[0x16];
        bVar3 = (bool)((byte)(uVar11 >> 0x17) & 1);
        auVar36[0x17] = bVar3 * auVar33[0x17] | !bVar3 * auVar28[0x17];
        auVar36[0x18] = (bVar6 & 1) * auVar33[0x18] | !(bool)(bVar6 & 1) * auVar28[0x18];
        bVar3 = (bool)((byte)(uVar11 >> 0x19) & 1);
        auVar36[0x19] = bVar3 * auVar33[0x19] | !bVar3 * auVar28[0x19];
        bVar3 = (bool)((byte)(uVar11 >> 0x1a) & 1);
        auVar36[0x1a] = bVar3 * auVar33[0x1a] | !bVar3 * auVar28[0x1a];
        bVar3 = (bool)((byte)(uVar11 >> 0x1b) & 1);
        auVar36[0x1b] = bVar3 * auVar33[0x1b] | !bVar3 * auVar28[0x1b];
        bVar3 = (bool)((byte)(uVar11 >> 0x1c) & 1);
        auVar36[0x1c] = bVar3 * auVar33[0x1c] | !bVar3 * auVar28[0x1c];
        bVar3 = (bool)((byte)(uVar11 >> 0x1d) & 1);
        auVar36[0x1d] = bVar3 * auVar33[0x1d] | !bVar3 * auVar28[0x1d];
        bVar3 = (bool)((byte)(uVar11 >> 0x1e) & 1);
        auVar36[0x1e] = bVar3 * auVar33[0x1e] | !bVar3 * auVar28[0x1e];
        bVar3 = (bool)((byte)(uVar11 >> 0x1f) & 1);
        auVar36[0x1f] = bVar3 * auVar33[0x1f] | !bVar3 * auVar28[0x1f];
        auVar36[0x20] = (bVar7 & 1) * auVar33[0x20] | !(bool)(bVar7 & 1) * auVar28[0x20];
        bVar3 = (bool)((byte)(uVar11 >> 0x21) & 1);
        auVar36[0x21] = bVar3 * auVar33[0x21] | !bVar3 * auVar28[0x21];
        bVar3 = (bool)((byte)(uVar11 >> 0x22) & 1);
        auVar36[0x22] = bVar3 * auVar33[0x22] | !bVar3 * auVar28[0x22];
        bVar3 = (bool)((byte)(uVar11 >> 0x23) & 1);
        auVar36[0x23] = bVar3 * auVar33[0x23] | !bVar3 * auVar28[0x23];
        bVar3 = (bool)((byte)(uVar11 >> 0x24) & 1);
        auVar36[0x24] = bVar3 * auVar33[0x24] | !bVar3 * auVar28[0x24];
        bVar3 = (bool)((byte)(uVar11 >> 0x25) & 1);
        auVar36[0x25] = bVar3 * auVar33[0x25] | !bVar3 * auVar28[0x25];
        bVar3 = (bool)((byte)(uVar11 >> 0x26) & 1);
        auVar36[0x26] = bVar3 * auVar33[0x26] | !bVar3 * auVar28[0x26];
        bVar3 = (bool)((byte)(uVar11 >> 0x27) & 1);
        auVar36[0x27] = bVar3 * auVar33[0x27] | !bVar3 * auVar28[0x27];
        auVar36[0x28] = (bVar8 & 1) * auVar33[0x28] | !(bool)(bVar8 & 1) * auVar28[0x28];
        bVar3 = (bool)((byte)(uVar11 >> 0x29) & 1);
        auVar36[0x29] = bVar3 * auVar33[0x29] | !bVar3 * auVar28[0x29];
        bVar3 = (bool)((byte)(uVar11 >> 0x2a) & 1);
        auVar36[0x2a] = bVar3 * auVar33[0x2a] | !bVar3 * auVar28[0x2a];
        bVar3 = (bool)((byte)(uVar11 >> 0x2b) & 1);
        auVar36[0x2b] = bVar3 * auVar33[0x2b] | !bVar3 * auVar28[0x2b];
        bVar3 = (bool)((byte)(uVar11 >> 0x2c) & 1);
        auVar36[0x2c] = bVar3 * auVar33[0x2c] | !bVar3 * auVar28[0x2c];
        bVar3 = (bool)((byte)(uVar11 >> 0x2d) & 1);
        auVar36[0x2d] = bVar3 * auVar33[0x2d] | !bVar3 * auVar28[0x2d];
        bVar3 = (bool)((byte)(uVar11 >> 0x2e) & 1);
        auVar36[0x2e] = bVar3 * auVar33[0x2e] | !bVar3 * auVar28[0x2e];
        bVar3 = (bool)((byte)(uVar11 >> 0x2f) & 1);
        auVar36[0x2f] = bVar3 * auVar33[0x2f] | !bVar3 * auVar28[0x2f];
        auVar36[0x30] = (bVar9 & 1) * auVar33[0x30] | !(bool)(bVar9 & 1) * auVar28[0x30];
        bVar3 = (bool)((byte)(uVar11 >> 0x31) & 1);
        auVar36[0x31] = bVar3 * auVar33[0x31] | !bVar3 * auVar28[0x31];
        bVar3 = (bool)((byte)(uVar11 >> 0x32) & 1);
        auVar36[0x32] = bVar3 * auVar33[0x32] | !bVar3 * auVar28[0x32];
        bVar3 = (bool)((byte)(uVar11 >> 0x33) & 1);
        auVar36[0x33] = bVar3 * auVar33[0x33] | !bVar3 * auVar28[0x33];
        bVar3 = (bool)((byte)(uVar11 >> 0x34) & 1);
        auVar36[0x34] = bVar3 * auVar33[0x34] | !bVar3 * auVar28[0x34];
        bVar3 = (bool)((byte)(uVar11 >> 0x35) & 1);
        auVar36[0x35] = bVar3 * auVar33[0x35] | !bVar3 * auVar28[0x35];
        bVar3 = (bool)((byte)(uVar11 >> 0x36) & 1);
        auVar36[0x36] = bVar3 * auVar33[0x36] | !bVar3 * auVar28[0x36];
        bVar3 = (bool)((byte)(uVar11 >> 0x37) & 1);
        auVar36[0x37] = bVar3 * auVar33[0x37] | !bVar3 * auVar28[0x37];
        auVar36[0x38] = (bVar10 & 1) * auVar33[0x38] | !(bool)(bVar10 & 1) * auVar28[0x38];
        bVar3 = (bool)(bVar10 >> 1 & 1);
        auVar36[0x39] = bVar3 * auVar33[0x39] | !bVar3 * auVar28[0x39];
        bVar3 = (bool)(bVar10 >> 2 & 1);
        auVar36[0x3a] = bVar3 * auVar33[0x3a] | !bVar3 * auVar28[0x3a];
        bVar3 = (bool)(bVar10 >> 3 & 1);
        auVar36[0x3b] = bVar3 * auVar33[0x3b] | !bVar3 * auVar28[0x3b];
        bVar3 = (bool)(bVar10 >> 4 & 1);
        auVar36[0x3c] = bVar3 * auVar33[0x3c] | !bVar3 * auVar28[0x3c];
        bVar3 = (bool)(bVar10 >> 5 & 1);
        auVar36[0x3d] = bVar3 * auVar33[0x3d] | !bVar3 * auVar28[0x3d];
        bVar3 = (bool)(bVar10 >> 6 & 1);
        auVar36[0x3e] = bVar3 * auVar33[0x3e] | !bVar3 * auVar28[0x3e];
        auVar36[0x3f] = -cVar12 * auVar33[0x3f] | !(bool)-cVar12 * auVar28[0x3f];
        auVar28 = vmovdqa64_avx512f(auVar36);
        auVar32 = vmovdqa64_avx512f(auVar29);
        auVar33 = vmovdqa64_avx512f(auVar1);
        auVar29 = vmovdqa64_avx512f(auVar32);
        auVar33 = vmovdqa64_avx512f(auVar33);
        auVar32 = vmovdqa64_avx512f(auVar32);
        auVar32 = vmovdqa64_avx512f(auVar32);
        auVar32 = vmovdqa64_avx512f(auVar32);
        auVar33 = vmovdqa64_avx512f(auVar33);
        auVar33 = vmovdqa64_avx512f(auVar33);
        auVar29 = vmovdqa64_avx512f(auVar29);
        auVar29 = vmovdqa64_avx512f(auVar29);
        auVar29 = vmovdqa64_avx512f(auVar29);
        auVar33 = vmovdqa64_avx512f(auVar33);
        auVar32 = vmovdqa64_avx512f(auVar32);
        auVar29 = vmovdqa64_avx512f(auVar29);
        auVar33 = vmovdqa64_avx512f(auVar33);
        auVar32 = vmovdqa64_avx512f(auVar32);
        auVar33 = vmovdqa64_avx512f(auVar33);
        auVar32 = vmovdqa64_avx512f(auVar32);
        auVar33 = vmovdqa64_avx512f(auVar33);
        auVar32 = vmovdqa64_avx512f(auVar32);
        auVar32 = vmovdqa64_avx512f(auVar32);
        auVar32 = vmovdqa64_avx512f(auVar32);
        auVar33 = vmovdqa64_avx512f(auVar33);
        auVar33 = vmovdqa64_avx512f(auVar33);
        auVar33 = vmovdqa64_avx512f(auVar33);
        auVar32 = vmovdqa64_avx512f(auVar32);
        auVar33 = vmovdqa64_avx512f(auVar33);
        auVar32 = vmovdqa64_avx512f(auVar32);
        auVar33 = vmovdqa64_avx512f(auVar33);
        auVar32 = vmovdqa64_avx512f(auVar32);
        auVar29 = vmovdqa64_avx512f(auVar29);
        auVar33 = vpsubb_avx512bw(auVar33,auVar32);
        auVar37[0] = (bVar2 & 1) * auVar33[0] | !(bool)(bVar2 & 1) * auVar29[0];
        bVar3 = (bool)((byte)(uVar11 >> 1) & 1);
        auVar37[1] = bVar3 * auVar33[1] | !bVar3 * auVar29[1];
        bVar3 = (bool)((byte)(uVar11 >> 2) & 1);
        auVar37[2] = bVar3 * auVar33[2] | !bVar3 * auVar29[2];
        bVar3 = (bool)((byte)(uVar11 >> 3) & 1);
        auVar37[3] = bVar3 * auVar33[3] | !bVar3 * auVar29[3];
        bVar3 = (bool)((byte)(uVar11 >> 4) & 1);
        auVar37[4] = bVar3 * auVar33[4] | !bVar3 * auVar29[4];
        bVar3 = (bool)((byte)(uVar11 >> 5) & 1);
        auVar37[5] = bVar3 * auVar33[5] | !bVar3 * auVar29[5];
        bVar3 = (bool)((byte)(uVar11 >> 6) & 1);
        auVar37[6] = bVar3 * auVar33[6] | !bVar3 * auVar29[6];
        bVar3 = (bool)((byte)(uVar11 >> 7) & 1);
        auVar37[7] = bVar3 * auVar33[7] | !bVar3 * auVar29[7];
        auVar37[8] = (bVar4 & 1) * auVar33[8] | !(bool)(bVar4 & 1) * auVar29[8];
        bVar3 = (bool)((byte)(uVar11 >> 9) & 1);
        auVar37[9] = bVar3 * auVar33[9] | !bVar3 * auVar29[9];
        bVar3 = (bool)((byte)(uVar11 >> 10) & 1);
        auVar37[10] = bVar3 * auVar33[10] | !bVar3 * auVar29[10];
        bVar3 = (bool)((byte)(uVar11 >> 0xb) & 1);
        auVar37[0xb] = bVar3 * auVar33[0xb] | !bVar3 * auVar29[0xb];
        bVar3 = (bool)((byte)(uVar11 >> 0xc) & 1);
        auVar37[0xc] = bVar3 * auVar33[0xc] | !bVar3 * auVar29[0xc];
        bVar3 = (bool)((byte)(uVar11 >> 0xd) & 1);
        auVar37[0xd] = bVar3 * auVar33[0xd] | !bVar3 * auVar29[0xd];
        bVar3 = (bool)((byte)(uVar11 >> 0xe) & 1);
        auVar37[0xe] = bVar3 * auVar33[0xe] | !bVar3 * auVar29[0xe];
        bVar3 = (bool)((byte)(uVar11 >> 0xf) & 1);
        auVar37[0xf] = bVar3 * auVar33[0xf] | !bVar3 * auVar29[0xf];
        auVar37[0x10] = (bVar5 & 1) * auVar33[0x10] | !(bool)(bVar5 & 1) * auVar29[0x10];
        bVar3 = (bool)((byte)(uVar11 >> 0x11) & 1);
        auVar37[0x11] = bVar3 * auVar33[0x11] | !bVar3 * auVar29[0x11];
        bVar3 = (bool)((byte)(uVar11 >> 0x12) & 1);
        auVar37[0x12] = bVar3 * auVar33[0x12] | !bVar3 * auVar29[0x12];
        bVar3 = (bool)((byte)(uVar11 >> 0x13) & 1);
        auVar37[0x13] = bVar3 * auVar33[0x13] | !bVar3 * auVar29[0x13];
        bVar3 = (bool)((byte)(uVar11 >> 0x14) & 1);
        auVar37[0x14] = bVar3 * auVar33[0x14] | !bVar3 * auVar29[0x14];
        bVar3 = (bool)((byte)(uVar11 >> 0x15) & 1);
        auVar37[0x15] = bVar3 * auVar33[0x15] | !bVar3 * auVar29[0x15];
        bVar3 = (bool)((byte)(uVar11 >> 0x16) & 1);
        auVar37[0x16] = bVar3 * auVar33[0x16] | !bVar3 * auVar29[0x16];
        bVar3 = (bool)((byte)(uVar11 >> 0x17) & 1);
        auVar37[0x17] = bVar3 * auVar33[0x17] | !bVar3 * auVar29[0x17];
        auVar37[0x18] = (bVar6 & 1) * auVar33[0x18] | !(bool)(bVar6 & 1) * auVar29[0x18];
        bVar3 = (bool)((byte)(uVar11 >> 0x19) & 1);
        auVar37[0x19] = bVar3 * auVar33[0x19] | !bVar3 * auVar29[0x19];
        bVar3 = (bool)((byte)(uVar11 >> 0x1a) & 1);
        auVar37[0x1a] = bVar3 * auVar33[0x1a] | !bVar3 * auVar29[0x1a];
        bVar3 = (bool)((byte)(uVar11 >> 0x1b) & 1);
        auVar37[0x1b] = bVar3 * auVar33[0x1b] | !bVar3 * auVar29[0x1b];
        bVar3 = (bool)((byte)(uVar11 >> 0x1c) & 1);
        auVar37[0x1c] = bVar3 * auVar33[0x1c] | !bVar3 * auVar29[0x1c];
        bVar3 = (bool)((byte)(uVar11 >> 0x1d) & 1);
        auVar37[0x1d] = bVar3 * auVar33[0x1d] | !bVar3 * auVar29[0x1d];
        bVar3 = (bool)((byte)(uVar11 >> 0x1e) & 1);
        auVar37[0x1e] = bVar3 * auVar33[0x1e] | !bVar3 * auVar29[0x1e];
        bVar3 = (bool)((byte)(uVar11 >> 0x1f) & 1);
        auVar37[0x1f] = bVar3 * auVar33[0x1f] | !bVar3 * auVar29[0x1f];
        auVar37[0x20] = (bVar7 & 1) * auVar33[0x20] | !(bool)(bVar7 & 1) * auVar29[0x20];
        bVar3 = (bool)((byte)(uVar11 >> 0x21) & 1);
        auVar37[0x21] = bVar3 * auVar33[0x21] | !bVar3 * auVar29[0x21];
        bVar3 = (bool)((byte)(uVar11 >> 0x22) & 1);
        auVar37[0x22] = bVar3 * auVar33[0x22] | !bVar3 * auVar29[0x22];
        bVar3 = (bool)((byte)(uVar11 >> 0x23) & 1);
        auVar37[0x23] = bVar3 * auVar33[0x23] | !bVar3 * auVar29[0x23];
        bVar3 = (bool)((byte)(uVar11 >> 0x24) & 1);
        auVar37[0x24] = bVar3 * auVar33[0x24] | !bVar3 * auVar29[0x24];
        bVar3 = (bool)((byte)(uVar11 >> 0x25) & 1);
        auVar37[0x25] = bVar3 * auVar33[0x25] | !bVar3 * auVar29[0x25];
        bVar3 = (bool)((byte)(uVar11 >> 0x26) & 1);
        auVar37[0x26] = bVar3 * auVar33[0x26] | !bVar3 * auVar29[0x26];
        bVar3 = (bool)((byte)(uVar11 >> 0x27) & 1);
        auVar37[0x27] = bVar3 * auVar33[0x27] | !bVar3 * auVar29[0x27];
        auVar37[0x28] = (bVar8 & 1) * auVar33[0x28] | !(bool)(bVar8 & 1) * auVar29[0x28];
        bVar3 = (bool)((byte)(uVar11 >> 0x29) & 1);
        auVar37[0x29] = bVar3 * auVar33[0x29] | !bVar3 * auVar29[0x29];
        bVar3 = (bool)((byte)(uVar11 >> 0x2a) & 1);
        auVar37[0x2a] = bVar3 * auVar33[0x2a] | !bVar3 * auVar29[0x2a];
        bVar3 = (bool)((byte)(uVar11 >> 0x2b) & 1);
        auVar37[0x2b] = bVar3 * auVar33[0x2b] | !bVar3 * auVar29[0x2b];
        bVar3 = (bool)((byte)(uVar11 >> 0x2c) & 1);
        auVar37[0x2c] = bVar3 * auVar33[0x2c] | !bVar3 * auVar29[0x2c];
        bVar3 = (bool)((byte)(uVar11 >> 0x2d) & 1);
        auVar37[0x2d] = bVar3 * auVar33[0x2d] | !bVar3 * auVar29[0x2d];
        bVar3 = (bool)((byte)(uVar11 >> 0x2e) & 1);
        auVar37[0x2e] = bVar3 * auVar33[0x2e] | !bVar3 * auVar29[0x2e];
        bVar3 = (bool)((byte)(uVar11 >> 0x2f) & 1);
        auVar37[0x2f] = bVar3 * auVar33[0x2f] | !bVar3 * auVar29[0x2f];
        auVar37[0x30] = (bVar9 & 1) * auVar33[0x30] | !(bool)(bVar9 & 1) * auVar29[0x30];
        bVar3 = (bool)((byte)(uVar11 >> 0x31) & 1);
        auVar37[0x31] = bVar3 * auVar33[0x31] | !bVar3 * auVar29[0x31];
        bVar3 = (bool)((byte)(uVar11 >> 0x32) & 1);
        auVar37[0x32] = bVar3 * auVar33[0x32] | !bVar3 * auVar29[0x32];
        bVar3 = (bool)((byte)(uVar11 >> 0x33) & 1);
        auVar37[0x33] = bVar3 * auVar33[0x33] | !bVar3 * auVar29[0x33];
        bVar3 = (bool)((byte)(uVar11 >> 0x34) & 1);
        auVar37[0x34] = bVar3 * auVar33[0x34] | !bVar3 * auVar29[0x34];
        bVar3 = (bool)((byte)(uVar11 >> 0x35) & 1);
        auVar37[0x35] = bVar3 * auVar33[0x35] | !bVar3 * auVar29[0x35];
        bVar3 = (bool)((byte)(uVar11 >> 0x36) & 1);
        auVar37[0x36] = bVar3 * auVar33[0x36] | !bVar3 * auVar29[0x36];
        bVar3 = (bool)((byte)(uVar11 >> 0x37) & 1);
        auVar37[0x37] = bVar3 * auVar33[0x37] | !bVar3 * auVar29[0x37];
        auVar37[0x38] = (bVar10 & 1) * auVar33[0x38] | !(bool)(bVar10 & 1) * auVar29[0x38];
        bVar3 = (bool)(bVar10 >> 1 & 1);
        auVar37[0x39] = bVar3 * auVar33[0x39] | !bVar3 * auVar29[0x39];
        bVar3 = (bool)(bVar10 >> 2 & 1);
        auVar37[0x3a] = bVar3 * auVar33[0x3a] | !bVar3 * auVar29[0x3a];
        bVar3 = (bool)(bVar10 >> 3 & 1);
        auVar37[0x3b] = bVar3 * auVar33[0x3b] | !bVar3 * auVar29[0x3b];
        bVar3 = (bool)(bVar10 >> 4 & 1);
        auVar37[0x3c] = bVar3 * auVar33[0x3c] | !bVar3 * auVar29[0x3c];
        bVar3 = (bool)(bVar10 >> 5 & 1);
        auVar37[0x3d] = bVar3 * auVar33[0x3d] | !bVar3 * auVar29[0x3d];
        bVar3 = (bool)(bVar10 >> 6 & 1);
        auVar37[0x3e] = bVar3 * auVar33[0x3e] | !bVar3 * auVar29[0x3e];
        auVar37[0x3f] = -cVar12 * auVar33[0x3f] | !(bool)-cVar12 * auVar29[0x3f];
        auVar29 = vmovdqa64_avx512f(auVar37);
        auVar32 = vmovdqa64_avx512f(auVar30);
        auVar33 = vmovdqa64_avx512f(auVar1);
        auVar30 = vmovdqa64_avx512f(auVar32);
        auVar33 = vmovdqa64_avx512f(auVar33);
        auVar32 = vmovdqa64_avx512f(auVar32);
        auVar32 = vmovdqa64_avx512f(auVar32);
        auVar32 = vmovdqa64_avx512f(auVar32);
        auVar33 = vmovdqa64_avx512f(auVar33);
        auVar33 = vmovdqa64_avx512f(auVar33);
        auVar30 = vmovdqa64_avx512f(auVar30);
        auVar30 = vmovdqa64_avx512f(auVar30);
        auVar30 = vmovdqa64_avx512f(auVar30);
        auVar33 = vmovdqa64_avx512f(auVar33);
        auVar32 = vmovdqa64_avx512f(auVar32);
        auVar30 = vmovdqa64_avx512f(auVar30);
        auVar33 = vmovdqa64_avx512f(auVar33);
        auVar32 = vmovdqa64_avx512f(auVar32);
        auVar33 = vmovdqa64_avx512f(auVar33);
        auVar32 = vmovdqa64_avx512f(auVar32);
        auVar33 = vmovdqa64_avx512f(auVar33);
        auVar32 = vmovdqa64_avx512f(auVar32);
        auVar32 = vmovdqa64_avx512f(auVar32);
        auVar32 = vmovdqa64_avx512f(auVar32);
        auVar33 = vmovdqa64_avx512f(auVar33);
        auVar33 = vmovdqa64_avx512f(auVar33);
        auVar33 = vmovdqa64_avx512f(auVar33);
        auVar32 = vmovdqa64_avx512f(auVar32);
        auVar33 = vmovdqa64_avx512f(auVar33);
        auVar32 = vmovdqa64_avx512f(auVar32);
        auVar33 = vmovdqa64_avx512f(auVar33);
        auVar32 = vmovdqa64_avx512f(auVar32);
        auVar30 = vmovdqa64_avx512f(auVar30);
        auVar33 = vpsubb_avx512bw(auVar33,auVar32);
        auVar38[0] = (bVar2 & 1) * auVar33[0] | !(bool)(bVar2 & 1) * auVar30[0];
        bVar3 = (bool)((byte)(uVar11 >> 1) & 1);
        auVar38[1] = bVar3 * auVar33[1] | !bVar3 * auVar30[1];
        bVar3 = (bool)((byte)(uVar11 >> 2) & 1);
        auVar38[2] = bVar3 * auVar33[2] | !bVar3 * auVar30[2];
        bVar3 = (bool)((byte)(uVar11 >> 3) & 1);
        auVar38[3] = bVar3 * auVar33[3] | !bVar3 * auVar30[3];
        bVar3 = (bool)((byte)(uVar11 >> 4) & 1);
        auVar38[4] = bVar3 * auVar33[4] | !bVar3 * auVar30[4];
        bVar3 = (bool)((byte)(uVar11 >> 5) & 1);
        auVar38[5] = bVar3 * auVar33[5] | !bVar3 * auVar30[5];
        bVar3 = (bool)((byte)(uVar11 >> 6) & 1);
        auVar38[6] = bVar3 * auVar33[6] | !bVar3 * auVar30[6];
        bVar3 = (bool)((byte)(uVar11 >> 7) & 1);
        auVar38[7] = bVar3 * auVar33[7] | !bVar3 * auVar30[7];
        auVar38[8] = (bVar4 & 1) * auVar33[8] | !(bool)(bVar4 & 1) * auVar30[8];
        bVar3 = (bool)((byte)(uVar11 >> 9) & 1);
        auVar38[9] = bVar3 * auVar33[9] | !bVar3 * auVar30[9];
        bVar3 = (bool)((byte)(uVar11 >> 10) & 1);
        auVar38[10] = bVar3 * auVar33[10] | !bVar3 * auVar30[10];
        bVar3 = (bool)((byte)(uVar11 >> 0xb) & 1);
        auVar38[0xb] = bVar3 * auVar33[0xb] | !bVar3 * auVar30[0xb];
        bVar3 = (bool)((byte)(uVar11 >> 0xc) & 1);
        auVar38[0xc] = bVar3 * auVar33[0xc] | !bVar3 * auVar30[0xc];
        bVar3 = (bool)((byte)(uVar11 >> 0xd) & 1);
        auVar38[0xd] = bVar3 * auVar33[0xd] | !bVar3 * auVar30[0xd];
        bVar3 = (bool)((byte)(uVar11 >> 0xe) & 1);
        auVar38[0xe] = bVar3 * auVar33[0xe] | !bVar3 * auVar30[0xe];
        bVar3 = (bool)((byte)(uVar11 >> 0xf) & 1);
        auVar38[0xf] = bVar3 * auVar33[0xf] | !bVar3 * auVar30[0xf];
        auVar38[0x10] = (bVar5 & 1) * auVar33[0x10] | !(bool)(bVar5 & 1) * auVar30[0x10];
        bVar3 = (bool)((byte)(uVar11 >> 0x11) & 1);
        auVar38[0x11] = bVar3 * auVar33[0x11] | !bVar3 * auVar30[0x11];
        bVar3 = (bool)((byte)(uVar11 >> 0x12) & 1);
        auVar38[0x12] = bVar3 * auVar33[0x12] | !bVar3 * auVar30[0x12];
        bVar3 = (bool)((byte)(uVar11 >> 0x13) & 1);
        auVar38[0x13] = bVar3 * auVar33[0x13] | !bVar3 * auVar30[0x13];
        bVar3 = (bool)((byte)(uVar11 >> 0x14) & 1);
        auVar38[0x14] = bVar3 * auVar33[0x14] | !bVar3 * auVar30[0x14];
        bVar3 = (bool)((byte)(uVar11 >> 0x15) & 1);
        auVar38[0x15] = bVar3 * auVar33[0x15] | !bVar3 * auVar30[0x15];
        bVar3 = (bool)((byte)(uVar11 >> 0x16) & 1);
        auVar38[0x16] = bVar3 * auVar33[0x16] | !bVar3 * auVar30[0x16];
        bVar3 = (bool)((byte)(uVar11 >> 0x17) & 1);
        auVar38[0x17] = bVar3 * auVar33[0x17] | !bVar3 * auVar30[0x17];
        auVar38[0x18] = (bVar6 & 1) * auVar33[0x18] | !(bool)(bVar6 & 1) * auVar30[0x18];
        bVar3 = (bool)((byte)(uVar11 >> 0x19) & 1);
        auVar38[0x19] = bVar3 * auVar33[0x19] | !bVar3 * auVar30[0x19];
        bVar3 = (bool)((byte)(uVar11 >> 0x1a) & 1);
        auVar38[0x1a] = bVar3 * auVar33[0x1a] | !bVar3 * auVar30[0x1a];
        bVar3 = (bool)((byte)(uVar11 >> 0x1b) & 1);
        auVar38[0x1b] = bVar3 * auVar33[0x1b] | !bVar3 * auVar30[0x1b];
        bVar3 = (bool)((byte)(uVar11 >> 0x1c) & 1);
        auVar38[0x1c] = bVar3 * auVar33[0x1c] | !bVar3 * auVar30[0x1c];
        bVar3 = (bool)((byte)(uVar11 >> 0x1d) & 1);
        auVar38[0x1d] = bVar3 * auVar33[0x1d] | !bVar3 * auVar30[0x1d];
        bVar3 = (bool)((byte)(uVar11 >> 0x1e) & 1);
        auVar38[0x1e] = bVar3 * auVar33[0x1e] | !bVar3 * auVar30[0x1e];
        bVar3 = (bool)((byte)(uVar11 >> 0x1f) & 1);
        auVar38[0x1f] = bVar3 * auVar33[0x1f] | !bVar3 * auVar30[0x1f];
        auVar38[0x20] = (bVar7 & 1) * auVar33[0x20] | !(bool)(bVar7 & 1) * auVar30[0x20];
        bVar3 = (bool)((byte)(uVar11 >> 0x21) & 1);
        auVar38[0x21] = bVar3 * auVar33[0x21] | !bVar3 * auVar30[0x21];
        bVar3 = (bool)((byte)(uVar11 >> 0x22) & 1);
        auVar38[0x22] = bVar3 * auVar33[0x22] | !bVar3 * auVar30[0x22];
        bVar3 = (bool)((byte)(uVar11 >> 0x23) & 1);
        auVar38[0x23] = bVar3 * auVar33[0x23] | !bVar3 * auVar30[0x23];
        bVar3 = (bool)((byte)(uVar11 >> 0x24) & 1);
        auVar38[0x24] = bVar3 * auVar33[0x24] | !bVar3 * auVar30[0x24];
        bVar3 = (bool)((byte)(uVar11 >> 0x25) & 1);
        auVar38[0x25] = bVar3 * auVar33[0x25] | !bVar3 * auVar30[0x25];
        bVar3 = (bool)((byte)(uVar11 >> 0x26) & 1);
        auVar38[0x26] = bVar3 * auVar33[0x26] | !bVar3 * auVar30[0x26];
        bVar3 = (bool)((byte)(uVar11 >> 0x27) & 1);
        auVar38[0x27] = bVar3 * auVar33[0x27] | !bVar3 * auVar30[0x27];
        auVar38[0x28] = (bVar8 & 1) * auVar33[0x28] | !(bool)(bVar8 & 1) * auVar30[0x28];
        bVar3 = (bool)((byte)(uVar11 >> 0x29) & 1);
        auVar38[0x29] = bVar3 * auVar33[0x29] | !bVar3 * auVar30[0x29];
        bVar3 = (bool)((byte)(uVar11 >> 0x2a) & 1);
        auVar38[0x2a] = bVar3 * auVar33[0x2a] | !bVar3 * auVar30[0x2a];
        bVar3 = (bool)((byte)(uVar11 >> 0x2b) & 1);
        auVar38[0x2b] = bVar3 * auVar33[0x2b] | !bVar3 * auVar30[0x2b];
        bVar3 = (bool)((byte)(uVar11 >> 0x2c) & 1);
        auVar38[0x2c] = bVar3 * auVar33[0x2c] | !bVar3 * auVar30[0x2c];
        bVar3 = (bool)((byte)(uVar11 >> 0x2d) & 1);
        auVar38[0x2d] = bVar3 * auVar33[0x2d] | !bVar3 * auVar30[0x2d];
        bVar3 = (bool)((byte)(uVar11 >> 0x2e) & 1);
        auVar38[0x2e] = bVar3 * auVar33[0x2e] | !bVar3 * auVar30[0x2e];
        bVar3 = (bool)((byte)(uVar11 >> 0x2f) & 1);
        auVar38[0x2f] = bVar3 * auVar33[0x2f] | !bVar3 * auVar30[0x2f];
        auVar38[0x30] = (bVar9 & 1) * auVar33[0x30] | !(bool)(bVar9 & 1) * auVar30[0x30];
        bVar3 = (bool)((byte)(uVar11 >> 0x31) & 1);
        auVar38[0x31] = bVar3 * auVar33[0x31] | !bVar3 * auVar30[0x31];
        bVar3 = (bool)((byte)(uVar11 >> 0x32) & 1);
        auVar38[0x32] = bVar3 * auVar33[0x32] | !bVar3 * auVar30[0x32];
        bVar3 = (bool)((byte)(uVar11 >> 0x33) & 1);
        auVar38[0x33] = bVar3 * auVar33[0x33] | !bVar3 * auVar30[0x33];
        bVar3 = (bool)((byte)(uVar11 >> 0x34) & 1);
        auVar38[0x34] = bVar3 * auVar33[0x34] | !bVar3 * auVar30[0x34];
        bVar3 = (bool)((byte)(uVar11 >> 0x35) & 1);
        auVar38[0x35] = bVar3 * auVar33[0x35] | !bVar3 * auVar30[0x35];
        bVar3 = (bool)((byte)(uVar11 >> 0x36) & 1);
        auVar38[0x36] = bVar3 * auVar33[0x36] | !bVar3 * auVar30[0x36];
        bVar3 = (bool)((byte)(uVar11 >> 0x37) & 1);
        auVar38[0x37] = bVar3 * auVar33[0x37] | !bVar3 * auVar30[0x37];
        auVar38[0x38] = (bVar10 & 1) * auVar33[0x38] | !(bool)(bVar10 & 1) * auVar30[0x38];
        bVar3 = (bool)(bVar10 >> 1 & 1);
        auVar38[0x39] = bVar3 * auVar33[0x39] | !bVar3 * auVar30[0x39];
        bVar3 = (bool)(bVar10 >> 2 & 1);
        auVar38[0x3a] = bVar3 * auVar33[0x3a] | !bVar3 * auVar30[0x3a];
        bVar3 = (bool)(bVar10 >> 3 & 1);
        auVar38[0x3b] = bVar3 * auVar33[0x3b] | !bVar3 * auVar30[0x3b];
        bVar3 = (bool)(bVar10 >> 4 & 1);
        auVar38[0x3c] = bVar3 * auVar33[0x3c] | !bVar3 * auVar30[0x3c];
        bVar3 = (bool)(bVar10 >> 5 & 1);
        auVar38[0x3d] = bVar3 * auVar33[0x3d] | !bVar3 * auVar30[0x3d];
        bVar3 = (bool)(bVar10 >> 6 & 1);
        auVar38[0x3e] = bVar3 * auVar33[0x3e] | !bVar3 * auVar30[0x3e];
        auVar38[0x3f] = -cVar12 * auVar33[0x3f] | !(bool)-cVar12 * auVar30[0x3f];
        auVar30 = vmovdqa64_avx512f(auVar38);
        auVar32 = vmovdqa64_avx512f(auVar31);
        auVar33 = vmovdqa64_avx512f(auVar1);
        auVar31 = vmovdqa64_avx512f(auVar32);
        auVar33 = vmovdqa64_avx512f(auVar33);
        auVar32 = vmovdqa64_avx512f(auVar32);
        auVar32 = vmovdqa64_avx512f(auVar32);
        auVar32 = vmovdqa64_avx512f(auVar32);
        auVar33 = vmovdqa64_avx512f(auVar33);
        auVar33 = vmovdqa64_avx512f(auVar33);
        auVar31 = vmovdqa64_avx512f(auVar31);
        auVar31 = vmovdqa64_avx512f(auVar31);
        auVar31 = vmovdqa64_avx512f(auVar31);
        auVar33 = vmovdqa64_avx512f(auVar33);
        auVar32 = vmovdqa64_avx512f(auVar32);
        auVar31 = vmovdqa64_avx512f(auVar31);
        auVar33 = vmovdqa64_avx512f(auVar33);
        auVar32 = vmovdqa64_avx512f(auVar32);
        auVar33 = vmovdqa64_avx512f(auVar33);
        auVar32 = vmovdqa64_avx512f(auVar32);
        auVar33 = vmovdqa64_avx512f(auVar33);
        auVar32 = vmovdqa64_avx512f(auVar32);
        auVar32 = vmovdqa64_avx512f(auVar32);
        auVar32 = vmovdqa64_avx512f(auVar32);
        auVar33 = vmovdqa64_avx512f(auVar33);
        auVar33 = vmovdqa64_avx512f(auVar33);
        auVar33 = vmovdqa64_avx512f(auVar33);
        auVar32 = vmovdqa64_avx512f(auVar32);
        auVar33 = vmovdqa64_avx512f(auVar33);
        auVar32 = vmovdqa64_avx512f(auVar32);
        auVar33 = vmovdqa64_avx512f(auVar33);
        auVar32 = vmovdqa64_avx512f(auVar32);
        auVar31 = vmovdqa64_avx512f(auVar31);
        auVar33 = vpsubb_avx512bw(auVar33,auVar32);
        auVar39[0] = (bVar2 & 1) * auVar33[0] | !(bool)(bVar2 & 1) * auVar31[0];
        bVar3 = (bool)((byte)(uVar11 >> 1) & 1);
        auVar39[1] = bVar3 * auVar33[1] | !bVar3 * auVar31[1];
        bVar3 = (bool)((byte)(uVar11 >> 2) & 1);
        auVar39[2] = bVar3 * auVar33[2] | !bVar3 * auVar31[2];
        bVar3 = (bool)((byte)(uVar11 >> 3) & 1);
        auVar39[3] = bVar3 * auVar33[3] | !bVar3 * auVar31[3];
        bVar3 = (bool)((byte)(uVar11 >> 4) & 1);
        auVar39[4] = bVar3 * auVar33[4] | !bVar3 * auVar31[4];
        bVar3 = (bool)((byte)(uVar11 >> 5) & 1);
        auVar39[5] = bVar3 * auVar33[5] | !bVar3 * auVar31[5];
        bVar3 = (bool)((byte)(uVar11 >> 6) & 1);
        auVar39[6] = bVar3 * auVar33[6] | !bVar3 * auVar31[6];
        bVar3 = (bool)((byte)(uVar11 >> 7) & 1);
        auVar39[7] = bVar3 * auVar33[7] | !bVar3 * auVar31[7];
        auVar39[8] = (bVar4 & 1) * auVar33[8] | !(bool)(bVar4 & 1) * auVar31[8];
        bVar3 = (bool)((byte)(uVar11 >> 9) & 1);
        auVar39[9] = bVar3 * auVar33[9] | !bVar3 * auVar31[9];
        bVar3 = (bool)((byte)(uVar11 >> 10) & 1);
        auVar39[10] = bVar3 * auVar33[10] | !bVar3 * auVar31[10];
        bVar3 = (bool)((byte)(uVar11 >> 0xb) & 1);
        auVar39[0xb] = bVar3 * auVar33[0xb] | !bVar3 * auVar31[0xb];
        bVar3 = (bool)((byte)(uVar11 >> 0xc) & 1);
        auVar39[0xc] = bVar3 * auVar33[0xc] | !bVar3 * auVar31[0xc];
        bVar3 = (bool)((byte)(uVar11 >> 0xd) & 1);
        auVar39[0xd] = bVar3 * auVar33[0xd] | !bVar3 * auVar31[0xd];
        bVar3 = (bool)((byte)(uVar11 >> 0xe) & 1);
        auVar39[0xe] = bVar3 * auVar33[0xe] | !bVar3 * auVar31[0xe];
        bVar3 = (bool)((byte)(uVar11 >> 0xf) & 1);
        auVar39[0xf] = bVar3 * auVar33[0xf] | !bVar3 * auVar31[0xf];
        auVar39[0x10] = (bVar5 & 1) * auVar33[0x10] | !(bool)(bVar5 & 1) * auVar31[0x10];
        bVar3 = (bool)((byte)(uVar11 >> 0x11) & 1);
        auVar39[0x11] = bVar3 * auVar33[0x11] | !bVar3 * auVar31[0x11];
        bVar3 = (bool)((byte)(uVar11 >> 0x12) & 1);
        auVar39[0x12] = bVar3 * auVar33[0x12] | !bVar3 * auVar31[0x12];
        bVar3 = (bool)((byte)(uVar11 >> 0x13) & 1);
        auVar39[0x13] = bVar3 * auVar33[0x13] | !bVar3 * auVar31[0x13];
        bVar3 = (bool)((byte)(uVar11 >> 0x14) & 1);
        auVar39[0x14] = bVar3 * auVar33[0x14] | !bVar3 * auVar31[0x14];
        bVar3 = (bool)((byte)(uVar11 >> 0x15) & 1);
        auVar39[0x15] = bVar3 * auVar33[0x15] | !bVar3 * auVar31[0x15];
        bVar3 = (bool)((byte)(uVar11 >> 0x16) & 1);
        auVar39[0x16] = bVar3 * auVar33[0x16] | !bVar3 * auVar31[0x16];
        bVar3 = (bool)((byte)(uVar11 >> 0x17) & 1);
        auVar39[0x17] = bVar3 * auVar33[0x17] | !bVar3 * auVar31[0x17];
        auVar39[0x18] = (bVar6 & 1) * auVar33[0x18] | !(bool)(bVar6 & 1) * auVar31[0x18];
        bVar3 = (bool)((byte)(uVar11 >> 0x19) & 1);
        auVar39[0x19] = bVar3 * auVar33[0x19] | !bVar3 * auVar31[0x19];
        bVar3 = (bool)((byte)(uVar11 >> 0x1a) & 1);
        auVar39[0x1a] = bVar3 * auVar33[0x1a] | !bVar3 * auVar31[0x1a];
        bVar3 = (bool)((byte)(uVar11 >> 0x1b) & 1);
        auVar39[0x1b] = bVar3 * auVar33[0x1b] | !bVar3 * auVar31[0x1b];
        bVar3 = (bool)((byte)(uVar11 >> 0x1c) & 1);
        auVar39[0x1c] = bVar3 * auVar33[0x1c] | !bVar3 * auVar31[0x1c];
        bVar3 = (bool)((byte)(uVar11 >> 0x1d) & 1);
        auVar39[0x1d] = bVar3 * auVar33[0x1d] | !bVar3 * auVar31[0x1d];
        bVar3 = (bool)((byte)(uVar11 >> 0x1e) & 1);
        auVar39[0x1e] = bVar3 * auVar33[0x1e] | !bVar3 * auVar31[0x1e];
        bVar3 = (bool)((byte)(uVar11 >> 0x1f) & 1);
        auVar39[0x1f] = bVar3 * auVar33[0x1f] | !bVar3 * auVar31[0x1f];
        auVar39[0x20] = (bVar7 & 1) * auVar33[0x20] | !(bool)(bVar7 & 1) * auVar31[0x20];
        bVar3 = (bool)((byte)(uVar11 >> 0x21) & 1);
        auVar39[0x21] = bVar3 * auVar33[0x21] | !bVar3 * auVar31[0x21];
        bVar3 = (bool)((byte)(uVar11 >> 0x22) & 1);
        auVar39[0x22] = bVar3 * auVar33[0x22] | !bVar3 * auVar31[0x22];
        bVar3 = (bool)((byte)(uVar11 >> 0x23) & 1);
        auVar39[0x23] = bVar3 * auVar33[0x23] | !bVar3 * auVar31[0x23];
        bVar3 = (bool)((byte)(uVar11 >> 0x24) & 1);
        auVar39[0x24] = bVar3 * auVar33[0x24] | !bVar3 * auVar31[0x24];
        bVar3 = (bool)((byte)(uVar11 >> 0x25) & 1);
        auVar39[0x25] = bVar3 * auVar33[0x25] | !bVar3 * auVar31[0x25];
        bVar3 = (bool)((byte)(uVar11 >> 0x26) & 1);
        auVar39[0x26] = bVar3 * auVar33[0x26] | !bVar3 * auVar31[0x26];
        bVar3 = (bool)((byte)(uVar11 >> 0x27) & 1);
        auVar39[0x27] = bVar3 * auVar33[0x27] | !bVar3 * auVar31[0x27];
        auVar39[0x28] = (bVar8 & 1) * auVar33[0x28] | !(bool)(bVar8 & 1) * auVar31[0x28];
        bVar3 = (bool)((byte)(uVar11 >> 0x29) & 1);
        auVar39[0x29] = bVar3 * auVar33[0x29] | !bVar3 * auVar31[0x29];
        bVar3 = (bool)((byte)(uVar11 >> 0x2a) & 1);
        auVar39[0x2a] = bVar3 * auVar33[0x2a] | !bVar3 * auVar31[0x2a];
        bVar3 = (bool)((byte)(uVar11 >> 0x2b) & 1);
        auVar39[0x2b] = bVar3 * auVar33[0x2b] | !bVar3 * auVar31[0x2b];
        bVar3 = (bool)((byte)(uVar11 >> 0x2c) & 1);
        auVar39[0x2c] = bVar3 * auVar33[0x2c] | !bVar3 * auVar31[0x2c];
        bVar3 = (bool)((byte)(uVar11 >> 0x2d) & 1);
        auVar39[0x2d] = bVar3 * auVar33[0x2d] | !bVar3 * auVar31[0x2d];
        bVar3 = (bool)((byte)(uVar11 >> 0x2e) & 1);
        auVar39[0x2e] = bVar3 * auVar33[0x2e] | !bVar3 * auVar31[0x2e];
        bVar3 = (bool)((byte)(uVar11 >> 0x2f) & 1);
        auVar39[0x2f] = bVar3 * auVar33[0x2f] | !bVar3 * auVar31[0x2f];
        auVar39[0x30] = (bVar9 & 1) * auVar33[0x30] | !(bool)(bVar9 & 1) * auVar31[0x30];
        bVar3 = (bool)((byte)(uVar11 >> 0x31) & 1);
        auVar39[0x31] = bVar3 * auVar33[0x31] | !bVar3 * auVar31[0x31];
        bVar3 = (bool)((byte)(uVar11 >> 0x32) & 1);
        auVar39[0x32] = bVar3 * auVar33[0x32] | !bVar3 * auVar31[0x32];
        bVar3 = (bool)((byte)(uVar11 >> 0x33) & 1);
        auVar39[0x33] = bVar3 * auVar33[0x33] | !bVar3 * auVar31[0x33];
        bVar3 = (bool)((byte)(uVar11 >> 0x34) & 1);
        auVar39[0x34] = bVar3 * auVar33[0x34] | !bVar3 * auVar31[0x34];
        bVar3 = (bool)((byte)(uVar11 >> 0x35) & 1);
        auVar39[0x35] = bVar3 * auVar33[0x35] | !bVar3 * auVar31[0x35];
        bVar3 = (bool)((byte)(uVar11 >> 0x36) & 1);
        auVar39[0x36] = bVar3 * auVar33[0x36] | !bVar3 * auVar31[0x36];
        bVar3 = (bool)((byte)(uVar11 >> 0x37) & 1);
        auVar39[0x37] = bVar3 * auVar33[0x37] | !bVar3 * auVar31[0x37];
        auVar39[0x38] = (bVar10 & 1) * auVar33[0x38] | !(bool)(bVar10 & 1) * auVar31[0x38];
        bVar3 = (bool)(bVar10 >> 1 & 1);
        auVar39[0x39] = bVar3 * auVar33[0x39] | !bVar3 * auVar31[0x39];
        bVar3 = (bool)(bVar10 >> 2 & 1);
        auVar39[0x3a] = bVar3 * auVar33[0x3a] | !bVar3 * auVar31[0x3a];
        bVar3 = (bool)(bVar10 >> 3 & 1);
        auVar39[0x3b] = bVar3 * auVar33[0x3b] | !bVar3 * auVar31[0x3b];
        bVar3 = (bool)(bVar10 >> 4 & 1);
        auVar39[0x3c] = bVar3 * auVar33[0x3c] | !bVar3 * auVar31[0x3c];
        bVar3 = (bool)(bVar10 >> 5 & 1);
        auVar39[0x3d] = bVar3 * auVar33[0x3d] | !bVar3 * auVar31[0x3d];
        bVar3 = (bool)(bVar10 >> 6 & 1);
        auVar39[0x3e] = bVar3 * auVar33[0x3e] | !bVar3 * auVar31[0x3e];
        auVar39[0x3f] = -cVar12 * auVar33[0x3f] | !(bool)-cVar12 * auVar31[0x3f];
        auVar31 = vmovdqa64_avx512f(auVar39);
        auVar33 = vmovdqa64_avx512f(auVar23);
        auVar32 = vmovdqa64_avx512f(auVar24);
        auVar24 = vmovdqa64_avx512f(auVar33);
        auVar33 = vmovdqa64_avx512f(auVar32);
        auVar33 = vmovdqa64_avx512f(auVar33);
        vmovdqa64_avx512f(auVar33);
        auVar24 = vmovdqa64_avx512f(auVar24);
        vmovdqa64_avx512f(auVar24);
        a_00[1] = in_stack_ffffffffffffcd80._0_8_;
        a_00[2] = in_stack_ffffffffffffcd80._8_8_;
        a_00[3] = in_stack_ffffffffffffcd80._16_8_;
        a_00[4] = in_stack_ffffffffffffcd80._24_8_;
        a_00[0] = in_stack_ffffffffffffcd78;
        a_00[5] = in_stack_ffffffffffffcda0;
        a_00[6] = in_stack_ffffffffffffcda8;
        a_00[7] = (longlong)in_stack_ffffffffffffcdb0;
        b[1] = in_stack_ffffffffffffcd40._0_8_;
        b[2] = in_stack_ffffffffffffcd40._8_8_;
        b[3] = in_stack_ffffffffffffcd40._16_8_;
        b[4] = in_stack_ffffffffffffcd40._24_8_;
        b[5] = in_stack_ffffffffffffcd40._32_8_;
        b[6] = in_stack_ffffffffffffcd40._40_8_;
        b[7] = in_stack_ffffffffffffcd40._48_8_;
        b[0] = in_stack_ffffffffffffcd38;
        VNNI8(in_stack_ffffffffffffcdf0,a_00,b);
        auVar24 = vmovdqa64_avx512f(auVar23);
        auVar25 = vmovdqa64_avx512f(auVar25);
        auVar24 = vmovdqa64_avx512f(auVar24);
        auVar25 = vmovdqa64_avx512f(auVar25);
        auVar25 = vmovdqa64_avx512f(auVar25);
        vmovdqa64_avx512f(auVar25);
        auVar24 = vmovdqa64_avx512f(auVar24);
        vmovdqa64_avx512f(auVar24);
        a_01[1] = in_stack_ffffffffffffcd80._0_8_;
        a_01[2] = in_stack_ffffffffffffcd80._8_8_;
        a_01[3] = in_stack_ffffffffffffcd80._16_8_;
        a_01[4] = in_stack_ffffffffffffcd80._24_8_;
        a_01[0] = in_stack_ffffffffffffcd78;
        a_01[5] = in_stack_ffffffffffffcda0;
        a_01[6] = in_stack_ffffffffffffcda8;
        a_01[7] = (longlong)in_stack_ffffffffffffcdb0;
        b_00[1] = in_stack_ffffffffffffcd40._0_8_;
        b_00[2] = in_stack_ffffffffffffcd40._8_8_;
        b_00[3] = in_stack_ffffffffffffcd40._16_8_;
        b_00[4] = in_stack_ffffffffffffcd40._24_8_;
        b_00[5] = in_stack_ffffffffffffcd40._32_8_;
        b_00[6] = in_stack_ffffffffffffcd40._40_8_;
        b_00[7] = in_stack_ffffffffffffcd40._48_8_;
        b_00[0] = in_stack_ffffffffffffcd38;
        VNNI8(in_stack_ffffffffffffcdf0,a_01,b_00);
        auVar24 = vmovdqa64_avx512f(auVar23);
        auVar25 = vmovdqa64_avx512f(auVar26);
        auVar24 = vmovdqa64_avx512f(auVar24);
        auVar25 = vmovdqa64_avx512f(auVar25);
        auVar25 = vmovdqa64_avx512f(auVar25);
        vmovdqa64_avx512f(auVar25);
        auVar24 = vmovdqa64_avx512f(auVar24);
        vmovdqa64_avx512f(auVar24);
        a_02[1] = in_stack_ffffffffffffcd80._0_8_;
        a_02[2] = in_stack_ffffffffffffcd80._8_8_;
        a_02[3] = in_stack_ffffffffffffcd80._16_8_;
        a_02[4] = in_stack_ffffffffffffcd80._24_8_;
        a_02[0] = in_stack_ffffffffffffcd78;
        a_02[5] = in_stack_ffffffffffffcda0;
        a_02[6] = in_stack_ffffffffffffcda8;
        a_02[7] = (longlong)in_stack_ffffffffffffcdb0;
        b_01[1] = in_stack_ffffffffffffcd40._0_8_;
        b_01[2] = in_stack_ffffffffffffcd40._8_8_;
        b_01[3] = in_stack_ffffffffffffcd40._16_8_;
        b_01[4] = in_stack_ffffffffffffcd40._24_8_;
        b_01[5] = in_stack_ffffffffffffcd40._32_8_;
        b_01[6] = in_stack_ffffffffffffcd40._40_8_;
        b_01[7] = in_stack_ffffffffffffcd40._48_8_;
        b_01[0] = in_stack_ffffffffffffcd38;
        VNNI8(in_stack_ffffffffffffcdf0,a_02,b_01);
        auVar24 = vmovdqa64_avx512f(auVar23);
        auVar25 = vmovdqa64_avx512f(auVar27);
        auVar24 = vmovdqa64_avx512f(auVar24);
        auVar25 = vmovdqa64_avx512f(auVar25);
        auVar25 = vmovdqa64_avx512f(auVar25);
        vmovdqa64_avx512f(auVar25);
        auVar24 = vmovdqa64_avx512f(auVar24);
        vmovdqa64_avx512f(auVar24);
        a_03[1] = in_stack_ffffffffffffcd80._0_8_;
        a_03[2] = in_stack_ffffffffffffcd80._8_8_;
        a_03[3] = in_stack_ffffffffffffcd80._16_8_;
        a_03[4] = in_stack_ffffffffffffcd80._24_8_;
        a_03[0] = in_stack_ffffffffffffcd78;
        a_03[5] = in_stack_ffffffffffffcda0;
        a_03[6] = in_stack_ffffffffffffcda8;
        a_03[7] = (longlong)in_stack_ffffffffffffcdb0;
        b_02[1] = in_stack_ffffffffffffcd40._0_8_;
        b_02[2] = in_stack_ffffffffffffcd40._8_8_;
        b_02[3] = in_stack_ffffffffffffcd40._16_8_;
        b_02[4] = in_stack_ffffffffffffcd40._24_8_;
        b_02[5] = in_stack_ffffffffffffcd40._32_8_;
        b_02[6] = in_stack_ffffffffffffcd40._40_8_;
        b_02[7] = in_stack_ffffffffffffcd40._48_8_;
        b_02[0] = in_stack_ffffffffffffcd38;
        VNNI8(in_stack_ffffffffffffcdf0,a_03,b_02);
        auVar24 = vmovdqa64_avx512f(auVar23);
        auVar25 = vmovdqa64_avx512f(auVar28);
        auVar24 = vmovdqa64_avx512f(auVar24);
        auVar25 = vmovdqa64_avx512f(auVar25);
        auVar25 = vmovdqa64_avx512f(auVar25);
        vmovdqa64_avx512f(auVar25);
        auVar24 = vmovdqa64_avx512f(auVar24);
        vmovdqa64_avx512f(auVar24);
        a_04[1] = in_stack_ffffffffffffcd80._0_8_;
        a_04[2] = in_stack_ffffffffffffcd80._8_8_;
        a_04[3] = in_stack_ffffffffffffcd80._16_8_;
        a_04[4] = in_stack_ffffffffffffcd80._24_8_;
        a_04[0] = in_stack_ffffffffffffcd78;
        a_04[5] = in_stack_ffffffffffffcda0;
        a_04[6] = in_stack_ffffffffffffcda8;
        a_04[7] = (longlong)in_stack_ffffffffffffcdb0;
        b_03[1] = in_stack_ffffffffffffcd40._0_8_;
        b_03[2] = in_stack_ffffffffffffcd40._8_8_;
        b_03[3] = in_stack_ffffffffffffcd40._16_8_;
        b_03[4] = in_stack_ffffffffffffcd40._24_8_;
        b_03[5] = in_stack_ffffffffffffcd40._32_8_;
        b_03[6] = in_stack_ffffffffffffcd40._40_8_;
        b_03[7] = in_stack_ffffffffffffcd40._48_8_;
        b_03[0] = in_stack_ffffffffffffcd38;
        VNNI8(in_stack_ffffffffffffcdf0,a_04,b_03);
        auVar24 = vmovdqa64_avx512f(auVar23);
        auVar25 = vmovdqa64_avx512f(auVar29);
        auVar24 = vmovdqa64_avx512f(auVar24);
        auVar25 = vmovdqa64_avx512f(auVar25);
        auVar25 = vmovdqa64_avx512f(auVar25);
        vmovdqa64_avx512f(auVar25);
        auVar24 = vmovdqa64_avx512f(auVar24);
        vmovdqa64_avx512f(auVar24);
        a_05[1] = in_stack_ffffffffffffcd80._0_8_;
        a_05[2] = in_stack_ffffffffffffcd80._8_8_;
        a_05[3] = in_stack_ffffffffffffcd80._16_8_;
        a_05[4] = in_stack_ffffffffffffcd80._24_8_;
        a_05[0] = in_stack_ffffffffffffcd78;
        a_05[5] = in_stack_ffffffffffffcda0;
        a_05[6] = in_stack_ffffffffffffcda8;
        a_05[7] = (longlong)in_stack_ffffffffffffcdb0;
        b_04[1] = in_stack_ffffffffffffcd40._0_8_;
        b_04[2] = in_stack_ffffffffffffcd40._8_8_;
        b_04[3] = in_stack_ffffffffffffcd40._16_8_;
        b_04[4] = in_stack_ffffffffffffcd40._24_8_;
        b_04[5] = in_stack_ffffffffffffcd40._32_8_;
        b_04[6] = in_stack_ffffffffffffcd40._40_8_;
        b_04[7] = in_stack_ffffffffffffcd40._48_8_;
        b_04[0] = in_stack_ffffffffffffcd38;
        VNNI8(in_stack_ffffffffffffcdf0,a_05,b_04);
        auVar24 = vmovdqa64_avx512f(auVar23);
        auVar25 = vmovdqa64_avx512f(auVar30);
        auVar24 = vmovdqa64_avx512f(auVar24);
        auVar25 = vmovdqa64_avx512f(auVar25);
        auVar25 = vmovdqa64_avx512f(auVar25);
        vmovdqa64_avx512f(auVar25);
        auVar24 = vmovdqa64_avx512f(auVar24);
        vmovdqa64_avx512f(auVar24);
        a_06[1] = in_stack_ffffffffffffcd80._0_8_;
        a_06[2] = in_stack_ffffffffffffcd80._8_8_;
        a_06[3] = in_stack_ffffffffffffcd80._16_8_;
        a_06[4] = in_stack_ffffffffffffcd80._24_8_;
        a_06[0] = in_stack_ffffffffffffcd78;
        a_06[5] = in_stack_ffffffffffffcda0;
        a_06[6] = in_stack_ffffffffffffcda8;
        a_06[7] = (longlong)in_stack_ffffffffffffcdb0;
        b_05[1] = in_stack_ffffffffffffcd40._0_8_;
        b_05[2] = in_stack_ffffffffffffcd40._8_8_;
        b_05[3] = in_stack_ffffffffffffcd40._16_8_;
        b_05[4] = in_stack_ffffffffffffcd40._24_8_;
        b_05[5] = in_stack_ffffffffffffcd40._32_8_;
        b_05[6] = in_stack_ffffffffffffcd40._40_8_;
        b_05[7] = in_stack_ffffffffffffcd40._48_8_;
        b_05[0] = in_stack_ffffffffffffcd38;
        VNNI8(in_stack_ffffffffffffcdf0,a_06,b_05);
        auVar23 = vmovdqa64_avx512f(auVar23);
        auVar24 = vmovdqa64_avx512f(auVar31);
        auVar23 = vmovdqa64_avx512f(auVar23);
        auVar24 = vmovdqa64_avx512f(auVar24);
        auVar24 = vmovdqa64_avx512f(auVar24);
        vmovdqa64_avx512f(auVar24);
        auVar23 = vmovdqa64_avx512f(auVar23);
        vmovdqa64_avx512f(auVar23);
        a_07[1] = in_stack_ffffffffffffcd80._0_8_;
        a_07[2] = in_stack_ffffffffffffcd80._8_8_;
        a_07[3] = in_stack_ffffffffffffcd80._16_8_;
        a_07[4] = in_stack_ffffffffffffcd80._24_8_;
        a_07[0] = in_stack_ffffffffffffcd78;
        a_07[5] = in_stack_ffffffffffffcda0;
        a_07[6] = in_stack_ffffffffffffcda8;
        a_07[7] = (longlong)in_stack_ffffffffffffcdb0;
        b_06[1] = in_stack_ffffffffffffcd40._0_8_;
        b_06[2] = in_stack_ffffffffffffcd40._8_8_;
        b_06[3] = in_stack_ffffffffffffcd40._16_8_;
        b_06[4] = in_stack_ffffffffffffcd40._24_8_;
        b_06[5] = in_stack_ffffffffffffcd40._32_8_;
        b_06[6] = in_stack_ffffffffffffcd40._40_8_;
        b_06[7] = in_stack_ffffffffffffcd40._48_8_;
        b_06[0] = in_stack_ffffffffffffcd38;
        VNNI8(in_stack_ffffffffffffcdf0,a_07,b_06);
        local_1f30 = local_1f30 + 8;
      }
      auVar15 = vmovdqa64_avx512f(auVar15);
      auVar16 = vmovdqa64_avx512f(auVar16);
      auVar17 = vmovdqa64_avx512f(auVar17);
      auVar18 = vmovdqa64_avx512f(auVar18);
      auVar15 = vmovdqa64_avx512f(auVar15);
      auVar16 = vmovdqa64_avx512f(auVar16);
      auVar17 = vmovdqa64_avx512f(auVar17);
      auVar18 = vmovdqa64_avx512f(auVar18);
      auVar18 = vmovdqa64_avx512f(auVar18);
      vmovdqa64_avx512f(auVar18);
      auVar17 = vmovdqa64_avx512f(auVar17);
      vmovdqa64_avx512f(auVar17);
      auVar16 = vmovdqa64_avx512f(auVar16);
      vmovdqa64_avx512f(auVar16);
      auVar15 = vmovdqa64_avx512f(auVar15);
      vmovdqa64_avx512f(auVar15);
      sum0_00[1] = in_stack_ffffffffffffcfc0._0_8_;
      sum0_00[2] = in_stack_ffffffffffffcfc0._8_8_;
      sum0_00[3] = in_stack_ffffffffffffcfc0._16_8_;
      sum0_00[4] = in_stack_ffffffffffffcfc0._24_8_;
      sum0_00[5] = in_stack_ffffffffffffcfc0._32_8_;
      sum0_00[6] = in_stack_ffffffffffffcfc0._40_8_;
      sum0_00[7] = in_stack_ffffffffffffcfc0._48_8_;
      sum0_00[0] = in_stack_ffffffffffffcfb8;
      sum1_00[1] = in_stack_ffffffffffffcf80._0_8_;
      sum1_00[2] = in_stack_ffffffffffffcf80._8_8_;
      sum1_00[3] = in_stack_ffffffffffffcf80._16_8_;
      sum1_00[4] = in_stack_ffffffffffffcf80._24_8_;
      sum1_00[5] = in_stack_ffffffffffffcf80._32_8_;
      sum1_00[6] = in_stack_ffffffffffffcf80._40_8_;
      sum1_00[7] = in_stack_ffffffffffffcf80._48_8_;
      sum1_00[0] = in_stack_ffffffffffffcf78;
      sum2_00[1] = in_stack_ffffffffffffcf40._0_8_;
      sum2_00[2] = in_stack_ffffffffffffcf40._8_8_;
      sum2_00[3] = in_stack_ffffffffffffcf40._16_8_;
      sum2_00[4] = in_stack_ffffffffffffcf40._24_8_;
      sum2_00[5] = in_stack_ffffffffffffcf40._32_8_;
      sum2_00[6] = in_stack_ffffffffffffcf40._40_8_;
      sum2_00[7] = in_stack_ffffffffffffcf40._48_8_;
      sum2_00[0] = in_stack_ffffffffffffcf38;
      sum3_00[1] = in_stack_ffffffffffffcf00._0_8_;
      sum3_00[2] = in_stack_ffffffffffffcf00._8_8_;
      sum3_00[3] = in_stack_ffffffffffffcf00._16_8_;
      sum3_00[4] = in_stack_ffffffffffffcf00._24_8_;
      sum3_00[5] = in_stack_ffffffffffffcf00._32_8_;
      sum3_00[6] = in_stack_ffffffffffffcf00._40_8_;
      sum3_00[7] = in_stack_ffffffffffffcf00._48_8_;
      sum3_00[0] = in_stack_ffffffffffffcef8;
      Pack0123(sum0_00,sum1_00,sum2_00,sum3_00);
      auVar15 = vmovdqa64_avx512f(auVar15);
      auVar16 = vmovdqa64_avx512f(auVar19);
      auVar17 = vmovdqa64_avx512f(auVar20);
      auVar18 = vmovdqa64_avx512f(auVar21);
      auVar19 = vmovdqa64_avx512f(auVar22);
      auVar16 = vmovdqa64_avx512f(auVar16);
      in_stack_ffffffffffffcf80 = auVar16._0_56_;
      in_stack_ffffffffffffcfb8 = auVar16._56_8_;
      auVar17 = vmovdqa64_avx512f(auVar17);
      in_stack_ffffffffffffcf40 = auVar17._0_56_;
      in_stack_ffffffffffffcf78 = auVar17._56_8_;
      auVar18 = vmovdqa64_avx512f(auVar18);
      in_stack_ffffffffffffcf00 = auVar18._0_56_;
      in_stack_ffffffffffffcf38 = auVar18._56_8_;
      auVar19 = vmovdqa64_avx512f(auVar19);
      in_stack_ffffffffffffcef8 = auVar19._56_8_;
      auVar19 = vmovdqa64_avx512f(auVar19);
      auVar19 = vmovdqa64_avx512f(auVar19);
      in_stack_ffffffffffffcd40 = auVar19._0_56_;
      in_stack_ffffffffffffcd78 = auVar19._56_8_;
      auVar18 = vmovdqa64_avx512f(auVar18);
      auVar18 = vmovdqa64_avx512f(auVar18);
      in_stack_ffffffffffffcd38 = auVar18._56_8_;
      auVar17 = vmovdqa64_avx512f(auVar17);
      vmovdqa64_avx512f(auVar17);
      auVar16 = vmovdqa64_avx512f(auVar16);
      vmovdqa64_avx512f(auVar16);
      sum0_01[1] = in_stack_ffffffffffffcfc0._0_8_;
      sum0_01[2] = in_stack_ffffffffffffcfc0._8_8_;
      sum0_01[3] = in_stack_ffffffffffffcfc0._16_8_;
      sum0_01[4] = in_stack_ffffffffffffcfc0._24_8_;
      sum0_01[5] = in_stack_ffffffffffffcfc0._32_8_;
      sum0_01[6] = in_stack_ffffffffffffcfc0._40_8_;
      sum0_01[7] = in_stack_ffffffffffffcfc0._48_8_;
      sum0_01[0] = in_stack_ffffffffffffcfb8;
      sum1_01[1] = in_stack_ffffffffffffcf80._0_8_;
      sum1_01[2] = in_stack_ffffffffffffcf80._8_8_;
      sum1_01[3] = in_stack_ffffffffffffcf80._16_8_;
      sum1_01[4] = in_stack_ffffffffffffcf80._24_8_;
      sum1_01[5] = in_stack_ffffffffffffcf80._32_8_;
      sum1_01[6] = in_stack_ffffffffffffcf80._40_8_;
      sum1_01[7] = in_stack_ffffffffffffcf80._48_8_;
      sum1_01[0] = in_stack_ffffffffffffcf78;
      sum2_01[1] = in_stack_ffffffffffffcf40._0_8_;
      sum2_01[2] = in_stack_ffffffffffffcf40._8_8_;
      sum2_01[3] = in_stack_ffffffffffffcf40._16_8_;
      sum2_01[4] = in_stack_ffffffffffffcf40._24_8_;
      sum2_01[5] = in_stack_ffffffffffffcf40._32_8_;
      sum2_01[6] = in_stack_ffffffffffffcf40._40_8_;
      sum2_01[7] = in_stack_ffffffffffffcf40._48_8_;
      sum2_01[0] = in_stack_ffffffffffffcf38;
      sum3_01[1] = in_stack_ffffffffffffcf00._0_8_;
      sum3_01[2] = in_stack_ffffffffffffcf00._8_8_;
      sum3_01[3] = in_stack_ffffffffffffcf00._16_8_;
      sum3_01[4] = in_stack_ffffffffffffcf00._24_8_;
      sum3_01[5] = in_stack_ffffffffffffcf00._32_8_;
      sum3_01[6] = in_stack_ffffffffffffcf00._40_8_;
      sum3_01[7] = in_stack_ffffffffffffcf00._48_8_;
      sum3_01[0] = in_stack_ffffffffffffcef8;
      Pack0123(sum0_01,sum1_01,sum2_01,sum3_01);
      auVar16 = vmovdqa64_avx512f(auVar16);
      in_stack_ffffffffffffcfc0 = auVar16._0_56_;
      auVar15 = vmovdqa64_avx512f(auVar15);
      auVar16 = vmovdqa64_avx512f(auVar16);
      auVar15 = vmovdqa64_avx512f(auVar15);
      auVar40 = auVar15._0_56_;
      auVar16 = vmovdqa64_avx512f(auVar16);
      this = auVar16._0_8_;
      auVar17 = vmovdqa64_avx512f(auVar16);
      vmovdqa64_avx512f(auVar17);
      auVar17 = vmovdqa64_avx512f(auVar15);
      auVar14 = auVar17._0_32_;
      vmovdqa64_avx512f(auVar17);
      pack0123_00[1] = in_stack_ffffffffffffce80._0_8_;
      pack0123_00[2] = in_stack_ffffffffffffce80._8_8_;
      pack0123_00[3] = in_stack_ffffffffffffce80._16_8_;
      pack0123_00[4] = in_stack_ffffffffffffce80._24_8_;
      pack0123_00[0] = auVar15._56_8_;
      pack0123_00[5] = in_stack_ffffffffffffcea0;
      pack0123_00[6] = in_stack_ffffffffffffcea8;
      pack0123_00[7] = (longlong)in_stack_ffffffffffffceb0;
      pack4567_00[1] = auVar40._0_8_;
      pack4567_00[2] = auVar40._8_8_;
      pack4567_00[3] = auVar40._16_8_;
      pack4567_00[4] = auVar40._24_8_;
      pack4567_00[5] = auVar40._32_8_;
      pack4567_00[6] = auVar40._40_8_;
      pack4567_00[7] = auVar40._48_8_;
      pack4567_00[0] = auVar16._56_8_;
      PermuteSummer(pack0123_00,pack4567_00);
      in_stack_ffffffffffffcda0 = auVar14._0_8_;
      in_stack_ffffffffffffcda8 = auVar14._8_8_;
      in_stack_ffffffffffffcdb0 = auVar14._16_8_;
      uStack_3148 = auVar14._24_8_;
      in_stack_ffffffffffffcea0 = in_stack_ffffffffffffcda0;
      in_stack_ffffffffffffcea8 = in_stack_ffffffffffffcda8;
      in_stack_ffffffffffffceb0 = in_stack_ffffffffffffcdb0;
      callbacks::OutputBufferInfo::OutputBufferInfo
                ((OutputBufferInfo *)&stack0xffffffffffffcdf0,local_1f14,local_1f04,in_EDX,in_R8D);
      input[1] = in_stack_ffffffffffffcde0._0_8_;
      input[2] = in_stack_ffffffffffffcde0._8_8_;
      input[0] = uStack_3148;
      input[3] = (longlong)in_stack_ffffffffffffcdf0;
      callbacks::
      CallbackImpl<(intgemm::CPUType)3,_intgemm::callbacks::UnquantizeAndAddBiasAndWriteRelu>::Run
                (this,input,in_stack_ffffffffffffcdb0);
    }
  }
  return;
}

Assistant:

INTGEMM_AVX512VNNI static void Multiply(const int8_t *A, const int8_t *B, Index A_rows, Index width, Index B_cols, Callback callback) {
    assert(width % sizeof(Register) == 0);
    assert(B_cols % 8 == 0);
    assert(reinterpret_cast<uintptr_t>(A) % sizeof(Register) == 0);
    assert(reinterpret_cast<uintptr_t>(B) % sizeof(Register) == 0);
    auto callback_impl = callbacks::CallbackImpl<CPUType::AVX2, Callback>(callback);
    const Index simd_width = width / sizeof(Register);
    Register zeros = setzero_si<Register>();
    // Go over 8 columns of B at a time.
#pragma omp for
    for (Index B0_colidx = 0; B0_colidx < B_cols; B0_colidx += 8) {
      const Register *B0_col = reinterpret_cast<const Register*>(B) + B0_colidx * simd_width;
      // Process one row of A at a time.  Doesn't seem to be faster to do multiple rows of A at once.
      for (Index A_rowidx = 0; A_rowidx < A_rows; ++A_rowidx) {
        // Iterate over shared (inner) dimension.
        const Register *A_live = reinterpret_cast<const Register *>(A + A_rowidx * width);
        const Register *A_end = A_live + simd_width;
        const Register *B_live = B0_col;
        // TODO: separate first step.
        Register sum0 = zeros, sum1 = zeros, sum2 = zeros, sum3 = zeros, sum4 = zeros, sum5 = zeros, sum6 = zeros, sum7 = zeros;
        for (; A_live != A_end; ++A_live, B_live += 8) {
          Register a = *A_live;
          // Retrieve the conveniently consecutive values of B.
          Register b0 = *B_live;
          Register b1 = *(B_live + 1);
          Register b2 = *(B_live + 2);
          Register b3 = *(B_live + 3);
          Register b4 = *(B_live + 4);
          Register b5 = *(B_live + 5);
          Register b6 = *(B_live + 6);
          Register b7 = *(B_live + 7);
          // Get a mask where a is negative.
          __mmask64 neg_mask = _mm512_test_epi8_mask(a, _mm512_set1_epi8(-128));
          Register a_positive = _mm512_abs_epi8(a);
          // Negate by subtracting from zero with a mask.
          b0 = _mm512_mask_sub_epi8(b0, neg_mask, zeros, b0);
          b1 = _mm512_mask_sub_epi8(b1, neg_mask, zeros, b1);
          b2 = _mm512_mask_sub_epi8(b2, neg_mask, zeros, b2);
          b3 = _mm512_mask_sub_epi8(b3, neg_mask, zeros, b3);
          b4 = _mm512_mask_sub_epi8(b4, neg_mask, zeros, b4);
          b5 = _mm512_mask_sub_epi8(b5, neg_mask, zeros, b5);
          b6 = _mm512_mask_sub_epi8(b6, neg_mask, zeros, b6);
          b7 = _mm512_mask_sub_epi8(b7, neg_mask, zeros, b7);
          VNNI8(sum0, a_positive, b0);
          VNNI8(sum1, a_positive, b1);
          VNNI8(sum2, a_positive, b2);
          VNNI8(sum3, a_positive, b3);
          VNNI8(sum4, a_positive, b4);
          VNNI8(sum5, a_positive, b5);
          VNNI8(sum6, a_positive, b6);
          VNNI8(sum7, a_positive, b7);
        }
        Register pack0123 = Pack0123(sum0, sum1, sum2, sum3);
        Register pack4567 = Pack0123(sum4, sum5, sum6, sum7);
        auto total = PermuteSummer(pack0123, pack4567);
        callback_impl.Run(total, callbacks::OutputBufferInfo(A_rowidx, B0_colidx, A_rows, B_cols));
      }
    }
  }